

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_bicubic_pack16.h
# Opt level: O0

void ncnn::resize_bicubic_image_pack16
               (Mat *src,Mat *dst,float *alpha,int *xofs,float *beta,int *yofs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined1 (*pauVar12) [64];
  undefined1 (*pauVar13) [64];
  undefined1 (*pauVar14) [64];
  int iVar15;
  int iVar16;
  int iVar17;
  long in_RCX;
  uint *in_RDX;
  long *in_RSI;
  long *in_RDI;
  uint *in_R8;
  long in_R9;
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  __m512 _D;
  __m512 _rows3_4;
  __m512 _rows2_3;
  __m512 _rows1_2;
  __m512 _rows0_1;
  int dx_4;
  float *Dp;
  float *rows3p;
  float *rows2p;
  float *rows1p;
  float *rows0p;
  __m512 _b3;
  __m512 _b2;
  __m512 _b1;
  __m512 _b0;
  __m512 _rows3_3;
  __m512 _rows2_2;
  __m512 _rows1_1;
  __m512 _rows0;
  __m512 _S33_3;
  __m512 _S32_3;
  __m512 _S31_3;
  __m512 _S30_3;
  __m512 _S23_2;
  __m512 _S22_2;
  __m512 _S21_2;
  __m512 _S20_2;
  __m512 _S13_1;
  __m512 _S12_1;
  __m512 _S11_1;
  __m512 _S10_1;
  __m512 _S03;
  __m512 _S02;
  __m512 _S01;
  __m512 _S00;
  __m512 _a3_3;
  __m512 _a2_3;
  __m512 _a1_3;
  __m512 _a0_3;
  float *S3p_3;
  float *S2p_2;
  float *S1p_1;
  float *S0p;
  int sx_3;
  int dx_3;
  float *rows3p_4;
  float *rows2p_3;
  float *rows1p_2;
  float *rows0p_1;
  float *alphap_3;
  float *S3_3;
  float *S2_2;
  float *S1_1;
  float *S0;
  __m512 _rows3_2;
  __m512 _rows2_1;
  __m512 _rows1;
  __m512 _S33_2;
  __m512 _S32_2;
  __m512 _S31_2;
  __m512 _S30_2;
  __m512 _S23_1;
  __m512 _S22_1;
  __m512 _S21_1;
  __m512 _S20_1;
  __m512 _S13;
  __m512 _S12;
  __m512 _S11;
  __m512 _S10;
  __m512 _a3_2;
  __m512 _a2_2;
  __m512 _a1_2;
  __m512 _a0_2;
  float *S3p_2;
  float *S2p_1;
  float *S1p;
  int sx_2;
  int dx_2;
  float *rows3p_3;
  float *rows2p_2;
  float *rows1p_1;
  float *alphap_2;
  float *S3_2;
  float *S2_1;
  float *S1;
  float *rows2_old;
  float *rows1_old_1;
  float *rows0_old_2;
  __m512 _rows3_1;
  __m512 _rows2;
  __m512 _S33_1;
  __m512 _S32_1;
  __m512 _S31_1;
  __m512 _S30_1;
  __m512 _S23;
  __m512 _S22;
  __m512 _S21;
  __m512 _S20;
  __m512 _a3_1;
  __m512 _a2_1;
  __m512 _a1_1;
  __m512 _a0_1;
  float *S3p_1;
  float *S2p;
  int sx_1;
  int dx_1;
  float *rows3p_2;
  float *rows2p_1;
  float *alphap_1;
  float *S3_1;
  float *S2;
  float *rows1_old;
  float *rows0_old_1;
  __m512 _rows3;
  __m512 _S33;
  __m512 _S32;
  __m512 _S31;
  __m512 _S30;
  __m512 _a3;
  __m512 _a2;
  __m512 _a1;
  __m512 _a0;
  float *S3p;
  int sx;
  int dx;
  float *rows3p_1;
  float *alphap;
  float *S3;
  float *rows0_old;
  int sy;
  int dy;
  int prev_sy1;
  float *rows3;
  float *rows2;
  float *rows1;
  float *rows0;
  Mat rowsbuf3;
  Mat rowsbuf2;
  Mat rowsbuf1;
  Mat rowsbuf0;
  int h;
  int w;
  Allocator *in_stack_ffffffffffffb758;
  int in_stack_ffffffffffffb764;
  size_t in_stack_ffffffffffffb768;
  int in_stack_ffffffffffffb774;
  Mat *in_stack_ffffffffffffb778;
  undefined1 (**ppauVar22) [64];
  undefined8 local_4840;
  undefined8 uStack_4838;
  undefined8 uStack_4830;
  undefined8 uStack_4828;
  undefined8 uStack_4820;
  undefined8 uStack_4818;
  undefined8 uStack_4810;
  undefined8 uStack_4808;
  int local_46ec;
  undefined8 *local_46e8;
  undefined1 (*local_46e0) [64];
  undefined1 (*local_46d8) [64];
  undefined1 (*local_46d0) [64];
  undefined1 (*local_46c8) [64];
  undefined8 local_45c0;
  undefined8 uStack_45b8;
  undefined8 uStack_45b0;
  undefined8 uStack_45a8;
  undefined8 uStack_45a0;
  undefined8 uStack_4598;
  undefined8 uStack_4590;
  undefined8 uStack_4588;
  undefined8 local_4580;
  undefined8 uStack_4578;
  undefined8 uStack_4570;
  undefined8 uStack_4568;
  undefined8 uStack_4560;
  undefined8 uStack_4558;
  undefined8 uStack_4550;
  undefined8 uStack_4548;
  undefined8 local_4540;
  undefined8 uStack_4538;
  undefined8 uStack_4530;
  undefined8 uStack_4528;
  undefined8 uStack_4520;
  undefined8 uStack_4518;
  undefined8 uStack_4510;
  undefined8 uStack_4508;
  undefined8 local_4500;
  undefined8 uStack_44f8;
  undefined8 uStack_44f0;
  undefined8 uStack_44e8;
  undefined8 uStack_44e0;
  undefined8 uStack_44d8;
  undefined8 uStack_44d0;
  undefined8 uStack_44c8;
  int local_3f8c;
  uint *local_3f68;
  undefined8 local_3f40;
  undefined8 uStack_3f38;
  undefined8 uStack_3f30;
  undefined8 uStack_3f28;
  undefined8 uStack_3f20;
  undefined8 uStack_3f18;
  undefined8 uStack_3f10;
  undefined8 uStack_3f08;
  undefined8 local_3f00;
  undefined8 uStack_3ef8;
  undefined8 uStack_3ef0;
  undefined8 uStack_3ee8;
  undefined8 uStack_3ee0;
  undefined8 uStack_3ed8;
  undefined8 uStack_3ed0;
  undefined8 uStack_3ec8;
  undefined8 local_3ec0;
  undefined8 uStack_3eb8;
  undefined8 uStack_3eb0;
  undefined8 uStack_3ea8;
  undefined8 uStack_3ea0;
  undefined8 uStack_3e98;
  undefined8 uStack_3e90;
  undefined8 uStack_3e88;
  int local_3a54;
  uint *local_3a38;
  undefined8 local_3a00;
  undefined8 uStack_39f8;
  undefined8 uStack_39f0;
  undefined8 uStack_39e8;
  undefined8 uStack_39e0;
  undefined8 uStack_39d8;
  undefined8 uStack_39d0;
  undefined8 uStack_39c8;
  undefined8 local_39c0;
  undefined8 uStack_39b8;
  undefined8 uStack_39b0;
  undefined8 uStack_39a8;
  undefined8 uStack_39a0;
  undefined8 uStack_3998;
  undefined8 uStack_3990;
  undefined8 uStack_3988;
  int local_363c;
  uint *local_3628;
  undefined8 local_3600;
  undefined8 uStack_35f8;
  undefined8 uStack_35f0;
  undefined8 uStack_35e8;
  undefined8 uStack_35e0;
  undefined8 uStack_35d8;
  undefined8 uStack_35d0;
  undefined8 uStack_35c8;
  int local_3384;
  uint *local_3378;
  int local_3358;
  int local_3354;
  undefined1 (*local_3350) [64];
  undefined1 (*local_3348) [64];
  undefined1 (*local_3340) [64];
  undefined1 (*local_3338) [64];
  undefined1 (*local_3330) [64];
  int *local_3328;
  undefined8 local_3320;
  undefined4 local_3318;
  long *local_3310;
  undefined4 local_3308;
  undefined4 local_3304;
  undefined4 local_3300;
  undefined4 local_32fc;
  undefined4 local_32f8;
  undefined8 local_32f0;
  undefined1 (*local_32e8) [64];
  int *local_32e0;
  undefined8 local_32d8;
  undefined4 local_32d0;
  long *local_32c8;
  undefined4 local_32c0;
  undefined4 local_32bc;
  undefined4 local_32b8;
  undefined4 local_32b4;
  undefined4 local_32b0;
  undefined8 local_32a8;
  undefined1 (*local_3290) [64];
  int *local_3288;
  undefined8 local_3280;
  undefined4 local_3278;
  long *local_3270;
  undefined4 local_3268;
  undefined4 local_3264;
  undefined4 local_3260;
  undefined4 local_325c;
  undefined4 local_3258;
  undefined8 local_3250;
  undefined1 (*local_3248) [64];
  int *local_3240;
  undefined8 local_3238;
  undefined4 local_3230;
  long *local_3228;
  undefined4 local_3220;
  undefined4 local_321c;
  undefined4 local_3218;
  undefined4 local_3214;
  undefined4 local_3210;
  undefined8 local_3208;
  int local_3200;
  int local_31fc;
  long local_31f8;
  uint *local_31f0;
  long local_31e8;
  uint *local_31e0;
  long *local_31d8;
  long *local_31d0;
  undefined1 (**local_31c8) [64];
  undefined1 (**local_31c0) [64];
  undefined1 (**local_31b0) [64];
  undefined1 (**local_31a0) [64];
  int local_318c;
  long *local_3188;
  int local_317c;
  long *local_3178;
  int local_316c;
  long *local_3168;
  int local_315c;
  long *local_3158;
  int local_314c;
  long *local_3148;
  int local_313c;
  long *local_3138;
  int local_312c;
  long *local_3128;
  int local_311c;
  long *local_3118;
  int local_310c;
  long *local_3108;
  int local_30fc;
  long *local_30f8;
  int local_30ec;
  long *local_30e8;
  undefined1 (*local_30e0) [64];
  undefined1 (*local_30d8) [64];
  undefined1 (*local_30d0) [64];
  undefined1 (*local_30c8) [64];
  undefined1 (*local_30c0) [64];
  undefined1 (*local_30b8) [64];
  undefined1 (*local_30b0) [64];
  undefined1 (*local_30a8) [64];
  undefined1 (*local_30a0) [64];
  undefined1 (*local_3098) [64];
  undefined1 (*local_3090) [64];
  undefined1 (*local_3088) [64];
  undefined1 (*local_3080) [64];
  undefined1 (*local_3078) [64];
  undefined1 (*local_3070) [64];
  undefined1 (*local_3068) [64];
  undefined1 (*local_3060) [64];
  undefined1 (*local_3058) [64];
  undefined1 (*local_3050) [64];
  undefined1 (*local_3048) [64];
  undefined1 (*local_3040) [64];
  undefined1 (*local_3038) [64];
  undefined1 (*local_3030) [64];
  undefined1 (*local_3028) [64];
  undefined1 (*local_3020) [64];
  undefined1 (*local_3018) [64];
  undefined1 (*local_3010) [64];
  undefined1 (*local_3008) [64];
  undefined1 (*local_3000) [64];
  undefined1 (*local_2ff8) [64];
  undefined1 (*local_2ff0) [64];
  undefined1 (*local_2fe8) [64];
  undefined1 (*local_2fe0) [64];
  undefined1 (*local_2fd8) [64];
  undefined1 (*local_2fd0) [64];
  undefined1 (*local_2fc8) [64];
  undefined1 (*local_2fc0) [64];
  undefined1 (*local_2fb8) [64];
  undefined1 (*local_2fb0) [64];
  undefined1 (*local_2fa8) [64];
  undefined1 (*local_2fa0) [64];
  undefined1 (*local_2f98) [64];
  undefined1 (*local_2f90) [64];
  undefined1 (*local_2f88) [64];
  undefined8 local_2f80;
  undefined8 uStack_2f78;
  undefined8 uStack_2f70;
  undefined8 uStack_2f68;
  undefined8 uStack_2f60;
  undefined8 uStack_2f58;
  undefined8 uStack_2f50;
  undefined8 uStack_2f48;
  undefined8 *local_2f08;
  undefined8 local_2f00;
  undefined8 uStack_2ef8;
  undefined8 uStack_2ef0;
  undefined8 uStack_2ee8;
  undefined8 uStack_2ee0;
  undefined8 uStack_2ed8;
  undefined8 uStack_2ed0;
  undefined8 uStack_2ec8;
  undefined8 *local_2e88;
  undefined8 local_2e80;
  undefined8 uStack_2e78;
  undefined8 uStack_2e70;
  undefined8 uStack_2e68;
  undefined8 uStack_2e60;
  undefined8 uStack_2e58;
  undefined8 uStack_2e50;
  undefined8 uStack_2e48;
  undefined8 *local_2e08;
  undefined8 local_2e00;
  undefined8 uStack_2df8;
  undefined8 uStack_2df0;
  undefined8 uStack_2de8;
  undefined8 uStack_2de0;
  undefined8 uStack_2dd8;
  undefined8 uStack_2dd0;
  undefined8 uStack_2dc8;
  undefined8 *local_2d88;
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  undefined8 uStack_2d60;
  undefined8 uStack_2d58;
  undefined8 uStack_2d50;
  undefined8 uStack_2d48;
  undefined8 *local_2d08;
  undefined8 local_2d00;
  undefined8 uStack_2cf8;
  undefined8 uStack_2cf0;
  undefined8 uStack_2ce8;
  undefined8 uStack_2ce0;
  undefined8 uStack_2cd8;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  undefined8 *local_2c88;
  undefined8 local_2c80;
  undefined8 uStack_2c78;
  undefined8 uStack_2c70;
  undefined8 uStack_2c68;
  undefined8 uStack_2c60;
  undefined8 uStack_2c58;
  undefined8 uStack_2c50;
  undefined8 uStack_2c48;
  undefined8 *local_2c08;
  undefined8 local_2c00;
  undefined8 uStack_2bf8;
  undefined8 uStack_2bf0;
  undefined8 uStack_2be8;
  undefined8 uStack_2be0;
  undefined8 uStack_2bd8;
  undefined8 uStack_2bd0;
  undefined8 uStack_2bc8;
  undefined8 *local_2b88;
  undefined8 local_2b80;
  undefined8 uStack_2b78;
  undefined8 uStack_2b70;
  undefined8 uStack_2b68;
  undefined8 uStack_2b60;
  undefined8 uStack_2b58;
  undefined8 uStack_2b50;
  undefined8 uStack_2b48;
  undefined8 *local_2b08;
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  undefined8 uStack_2ae0;
  undefined8 uStack_2ad8;
  undefined8 uStack_2ad0;
  undefined8 uStack_2ac8;
  undefined8 *local_2a88;
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  undefined8 uStack_2a60;
  undefined8 uStack_2a58;
  undefined8 uStack_2a50;
  undefined8 uStack_2a48;
  undefined8 *local_2a08;
  undefined1 local_2a00 [64];
  uint local_2984;
  undefined1 local_2980 [64];
  uint local_2904;
  undefined1 local_2900 [64];
  uint local_2884;
  undefined1 local_2880 [64];
  uint local_2804;
  undefined1 local_2800 [64];
  uint local_2784;
  undefined1 local_2780 [64];
  uint local_2704;
  undefined1 local_2700 [64];
  uint local_2684;
  undefined1 local_2680 [64];
  uint local_2604;
  undefined1 local_2600 [64];
  uint local_2584;
  undefined1 local_2580 [64];
  uint local_2504;
  undefined1 local_2500 [64];
  uint local_2484;
  undefined1 local_2480 [64];
  uint local_2404;
  undefined1 local_2400 [64];
  uint local_2384;
  undefined1 local_2380 [64];
  uint local_2304;
  undefined1 local_2300 [64];
  uint local_2284;
  undefined1 local_2280 [64];
  uint local_2204;
  undefined1 local_2200 [64];
  uint local_2184;
  undefined1 local_2180 [64];
  uint local_2104;
  undefined1 local_2100 [64];
  uint local_2084;
  undefined1 local_2080 [64];
  uint local_2004;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 uStack_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 uStack_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined8 uStack_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined8 uStack_1f20;
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 uStack_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined8 uStack_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined8 uStack_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 uStack_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 uStack_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 uStack_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 uStack_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 uStack_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 uStack_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 uStack_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 uStack_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 uStack_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 uStack_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 uStack_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 uStack_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 uStack_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 uStack_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 uStack_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 uStack_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 uStack_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 uStack_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 uStack_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 uStack_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 uStack_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 uStack_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 uStack_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 uStack_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 uStack_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 uStack_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 uStack_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 uStack_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 uStack_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 uStack_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 uStack_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 uStack_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 uStack_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 uStack_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 uStack_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 uStack_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 uStack_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 uStack_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 uStack_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 uStack_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 uStack_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 uStack_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 uStack_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 uStack_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 uStack_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 uStack_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 uStack_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 uStack_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 uStack_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 uStack_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 uStack_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 uStack_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 uStack_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 uStack_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 uStack_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 uStack_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 uStack_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 uStack_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 uStack_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 uStack_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 uStack_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 uStack_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 uStack_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 uStack_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 uStack_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 uStack_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 uStack_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 uStack_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 uStack_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 uStack_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 uStack_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 uStack_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 uStack_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 uStack_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 uStack_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 uStack_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 uStack_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 uStack_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 uStack_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 uStack_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 uStack_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 uStack_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 uStack_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 uStack_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 uStack_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 uStack_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 uStack_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 uStack_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 uStack_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 uStack_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 uStack_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 uStack_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 uStack_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 uStack_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 uStack_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 uStack_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 uStack_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 uStack_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 uStack_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 uStack_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 uStack_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 uStack_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 uStack_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 uStack_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 uStack_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 uStack_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 uStack_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 uStack_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  int local_1a8;
  undefined4 local_1a4;
  undefined1 (**local_1a0) [64];
  int local_188;
  undefined4 local_184;
  undefined1 (**local_180) [64];
  int local_168;
  undefined4 local_164;
  undefined1 (**local_160) [64];
  int local_158;
  undefined4 local_154;
  undefined1 (**local_150) [64];
  undefined1 (*local_148) [64];
  undefined1 (*local_140) [64];
  undefined1 (*local_130) [64];
  undefined1 (*local_120) [64];
  undefined8 local_110;
  undefined4 local_104;
  undefined8 local_100;
  int local_f4;
  undefined1 (**local_f0) [64];
  undefined8 local_e8;
  undefined4 local_dc;
  undefined8 local_d8;
  int local_cc;
  undefined1 (**local_c8) [64];
  undefined8 local_c0;
  undefined4 local_b4;
  undefined8 local_b0;
  int local_a4;
  undefined1 (**local_a0) [64];
  undefined8 local_98;
  undefined4 local_8c;
  undefined8 local_88;
  int local_7c;
  undefined1 (**local_78) [64];
  undefined1 (**local_70) [64];
  undefined1 (**local_68) [64];
  undefined1 (**local_60) [64];
  undefined1 (**local_58) [64];
  
  local_31fc = *(int *)((long)in_RSI + 0x2c);
  local_3200 = (int)in_RSI[6];
  local_f0 = &local_3248;
  local_100 = 0x40;
  local_104 = 0x10;
  local_110 = 0;
  local_3248 = (undefined1 (*) [64])0x0;
  local_3240 = (int *)0x0;
  local_3238 = 0;
  local_3230 = 0;
  local_3228 = (long *)0x0;
  local_3220 = 0;
  local_321c = 0;
  local_3218 = 0;
  local_3214 = 0;
  local_3210 = 0;
  local_3208 = 0;
  local_31f8 = in_R9;
  local_31f0 = in_R8;
  local_31e8 = in_RCX;
  local_31e0 = in_RDX;
  local_31d8 = in_RSI;
  local_31d0 = in_RDI;
  local_f4 = local_31fc;
  Mat::create(in_stack_ffffffffffffb778,in_stack_ffffffffffffb774,in_stack_ffffffffffffb768,
              in_stack_ffffffffffffb764,in_stack_ffffffffffffb758);
  local_c8 = &local_3290;
  local_cc = local_31fc;
  local_d8 = 0x40;
  local_dc = 0x10;
  local_e8 = 0;
  local_3290 = (undefined1 (*) [64])0x0;
  local_3288 = (int *)0x0;
  local_3280 = 0;
  local_3278 = 0;
  local_3270 = (long *)0x0;
  local_3268 = 0;
  local_3264 = 0;
  local_3260 = 0;
  local_325c = 0;
  local_3258 = 0;
  local_3250 = 0;
  Mat::create(in_stack_ffffffffffffb778,in_stack_ffffffffffffb774,in_stack_ffffffffffffb768,
              in_stack_ffffffffffffb764,in_stack_ffffffffffffb758);
  local_a0 = &local_32e8;
  local_a4 = local_31fc;
  local_b0 = 0x40;
  local_b4 = 0x10;
  local_c0 = 0;
  local_32e8 = (undefined1 (*) [64])0x0;
  local_32e0 = (int *)0x0;
  local_32d8 = 0;
  local_32d0 = 0;
  local_32c8 = (long *)0x0;
  local_32c0 = 0;
  local_32bc = 0;
  local_32b8 = 0;
  local_32b4 = 0;
  local_32b0 = 0;
  local_32a8 = 0;
  Mat::create(in_stack_ffffffffffffb778,in_stack_ffffffffffffb774,in_stack_ffffffffffffb768,
              in_stack_ffffffffffffb764,in_stack_ffffffffffffb758);
  local_78 = &local_3330;
  local_7c = local_31fc;
  local_88 = 0x40;
  local_8c = 0x10;
  local_98 = 0;
  local_3330 = (undefined1 (*) [64])0x0;
  local_3328 = (int *)0x0;
  local_3320 = 0;
  local_3318 = 0;
  local_3310 = (long *)0x0;
  local_3308 = 0;
  local_3304 = 0;
  local_3300 = 0;
  local_32fc = 0;
  local_32f8 = 0;
  local_32f0 = 0;
  Mat::create(in_stack_ffffffffffffb778,in_stack_ffffffffffffb774,in_stack_ffffffffffffb768,
              in_stack_ffffffffffffb764,in_stack_ffffffffffffb758);
  local_58 = &local_3248;
  local_3338 = local_3248;
  local_60 = &local_3290;
  local_3340 = local_3290;
  local_68 = &local_32e8;
  local_3348 = local_32e8;
  local_70 = &local_3330;
  local_3350 = local_3330;
  local_3354 = -3;
  for (local_3358 = 0; pauVar14 = local_3338, pauVar13 = local_3340, pauVar12 = local_3348,
      local_3358 < local_3200; local_3358 = local_3358 + 1) {
    iVar1 = *(int *)(local_31f8 + (long)local_3358 * 4);
    if (iVar1 != local_3354) {
      if (iVar1 == local_3354 + 1) {
        local_3338 = local_3340;
        local_3340 = local_3348;
        local_3348 = local_3350;
        local_3350 = pauVar14;
        local_30fc = iVar1 + 2;
        local_30f8 = local_31d0;
        lVar4 = *local_31d0;
        iVar2 = *(int *)((long)local_31d0 + 0x2c);
        lVar5 = local_31d0[2];
        local_3378 = local_31e0;
        for (local_3384 = 0; local_3384 < local_31fc; local_3384 = local_3384 + 1) {
          local_2f90 = (undefined1 (*) [64])
                       (lVar4 + (long)iVar2 * (long)local_30fc * lVar5 +
                       (long)(*(int *)(local_31e8 + (long)local_3384 * 4) << 4) * 4);
          local_2004 = *local_3378;
          local_2080 = vbroadcastss_avx512f(ZEXT416(local_2004));
          local_2084 = local_3378[1];
          local_2100 = vbroadcastss_avx512f(ZEXT416(local_2084));
          local_2104 = local_3378[2];
          local_2180 = vbroadcastss_avx512f(ZEXT416(local_2104));
          local_2184 = local_3378[3];
          local_2200 = vbroadcastss_avx512f(ZEXT416(local_2184));
          local_2f88 = local_2f90 + -1;
          local_1ac0 = *(undefined8 *)*local_2f88;
          uStack_1ab8 = *(undefined8 *)(local_2f90[-1] + 8);
          uStack_1ab0 = *(undefined8 *)(local_2f90[-1] + 0x10);
          uStack_1aa8 = *(undefined8 *)(local_2f90[-1] + 0x18);
          uStack_1aa0 = *(undefined8 *)(local_2f90[-1] + 0x20);
          uStack_1a98 = *(undefined8 *)(local_2f90[-1] + 0x28);
          uStack_1a90 = *(undefined8 *)(local_2f90[-1] + 0x30);
          uStack_1a88 = *(undefined8 *)(local_2f90[-1] + 0x38);
          local_200 = *(undefined8 *)*local_2f90;
          uStack_1f8 = *(undefined8 *)(*local_2f90 + 8);
          uStack_1f0 = *(undefined8 *)(*local_2f90 + 0x10);
          uStack_1e8 = *(undefined8 *)(*local_2f90 + 0x18);
          uStack_1e0 = *(undefined8 *)(*local_2f90 + 0x20);
          uStack_1d8 = *(undefined8 *)(*local_2f90 + 0x28);
          uStack_1d0 = *(undefined8 *)(*local_2f90 + 0x30);
          uStack_1c8 = *(undefined8 *)(*local_2f90 + 0x38);
          local_2f98 = local_2f90 + 1;
          local_2c0 = *(undefined8 *)*local_2f98;
          uStack_2b8 = *(undefined8 *)(local_2f90[1] + 8);
          uStack_2b0 = *(undefined8 *)(local_2f90[1] + 0x10);
          uStack_2a8 = *(undefined8 *)(local_2f90[1] + 0x18);
          uStack_2a0 = *(undefined8 *)(local_2f90[1] + 0x20);
          uStack_298 = *(undefined8 *)(local_2f90[1] + 0x28);
          uStack_290 = *(undefined8 *)(local_2f90[1] + 0x30);
          uStack_288 = *(undefined8 *)(local_2f90[1] + 0x38);
          local_2fa0 = local_2f90 + 2;
          local_380 = *(undefined8 *)*local_2fa0;
          uStack_378 = *(undefined8 *)(local_2f90[2] + 8);
          uStack_370 = *(undefined8 *)(local_2f90[2] + 0x10);
          uStack_368 = *(undefined8 *)(local_2f90[2] + 0x18);
          uStack_360 = *(undefined8 *)(local_2f90[2] + 0x20);
          uStack_358 = *(undefined8 *)(local_2f90[2] + 0x28);
          uStack_350 = *(undefined8 *)(local_2f90[2] + 0x30);
          uStack_348 = *(undefined8 *)(local_2f90[2] + 0x38);
          local_1b00 = local_2080._0_8_;
          uStack_1af8 = local_2080._8_8_;
          uStack_1af0 = local_2080._16_8_;
          uStack_1ae8 = local_2080._24_8_;
          uStack_1ae0 = local_2080._32_8_;
          uStack_1ad8 = local_2080._40_8_;
          uStack_1ad0 = local_2080._48_8_;
          uStack_1ac8 = local_2080._56_8_;
          auVar21 = vmulps_avx512f(*local_2f88,local_2080);
          local_240 = local_2100._0_8_;
          uStack_238 = local_2100._8_8_;
          uStack_230 = local_2100._16_8_;
          uStack_228 = local_2100._24_8_;
          uStack_220 = local_2100._32_8_;
          uStack_218 = local_2100._40_8_;
          uStack_210 = local_2100._48_8_;
          uStack_208 = local_2100._56_8_;
          local_3600 = auVar21._0_8_;
          local_280 = local_3600;
          uStack_35f8 = auVar21._8_8_;
          uStack_278 = uStack_35f8;
          uStack_35f0 = auVar21._16_8_;
          uStack_270 = uStack_35f0;
          uStack_35e8 = auVar21._24_8_;
          uStack_268 = uStack_35e8;
          uStack_35e0 = auVar21._32_8_;
          uStack_260 = uStack_35e0;
          uStack_35d8 = auVar21._40_8_;
          uStack_258 = uStack_35d8;
          uStack_35d0 = auVar21._48_8_;
          uStack_250 = uStack_35d0;
          uStack_35c8 = auVar21._56_8_;
          uStack_248 = uStack_35c8;
          auVar21 = vfmadd213ps_avx512f(local_2100,*local_2f90,auVar21);
          local_300 = local_2180._0_8_;
          uStack_2f8 = local_2180._8_8_;
          uStack_2f0 = local_2180._16_8_;
          uStack_2e8 = local_2180._24_8_;
          uStack_2e0 = local_2180._32_8_;
          uStack_2d8 = local_2180._40_8_;
          uStack_2d0 = local_2180._48_8_;
          uStack_2c8 = local_2180._56_8_;
          local_3600 = auVar21._0_8_;
          local_340 = local_3600;
          uStack_35f8 = auVar21._8_8_;
          uStack_338 = uStack_35f8;
          uStack_35f0 = auVar21._16_8_;
          uStack_330 = uStack_35f0;
          uStack_35e8 = auVar21._24_8_;
          uStack_328 = uStack_35e8;
          uStack_35e0 = auVar21._32_8_;
          uStack_320 = uStack_35e0;
          uStack_35d8 = auVar21._40_8_;
          uStack_318 = uStack_35d8;
          uStack_35d0 = auVar21._48_8_;
          uStack_310 = uStack_35d0;
          uStack_35c8 = auVar21._56_8_;
          uStack_308 = uStack_35c8;
          auVar21 = vfmadd213ps_avx512f(local_2180,*local_2f98,auVar21);
          local_3c0 = local_2200._0_8_;
          uStack_3b8 = local_2200._8_8_;
          uStack_3b0 = local_2200._16_8_;
          uStack_3a8 = local_2200._24_8_;
          uStack_3a0 = local_2200._32_8_;
          uStack_398 = local_2200._40_8_;
          uStack_390 = local_2200._48_8_;
          uStack_388 = local_2200._56_8_;
          local_3600 = auVar21._0_8_;
          local_400 = local_3600;
          uStack_35f8 = auVar21._8_8_;
          uStack_3f8 = uStack_35f8;
          uStack_35f0 = auVar21._16_8_;
          uStack_3f0 = uStack_35f0;
          uStack_35e8 = auVar21._24_8_;
          uStack_3e8 = uStack_35e8;
          uStack_35e0 = auVar21._32_8_;
          uStack_3e0 = uStack_35e0;
          uStack_35d8 = auVar21._40_8_;
          uStack_3d8 = uStack_35d8;
          uStack_35d0 = auVar21._48_8_;
          uStack_3d0 = uStack_35d0;
          uStack_35c8 = auVar21._56_8_;
          uStack_3c8 = uStack_35c8;
          auVar21 = vfmadd213ps_avx512f(local_2200,*local_2fa0,auVar21);
          local_2a08 = (undefined8 *)(*pauVar14 + (long)(local_3384 << 4) * 4);
          local_3600 = auVar21._0_8_;
          local_2a80 = local_3600;
          uStack_35f8 = auVar21._8_8_;
          uStack_2a78 = uStack_35f8;
          uStack_35f0 = auVar21._16_8_;
          uStack_2a70 = uStack_35f0;
          uStack_35e8 = auVar21._24_8_;
          uStack_2a68 = uStack_35e8;
          uStack_35e0 = auVar21._32_8_;
          uStack_2a60 = uStack_35e0;
          uStack_35d8 = auVar21._40_8_;
          uStack_2a58 = uStack_35d8;
          uStack_35d0 = auVar21._48_8_;
          uStack_2a50 = uStack_35d0;
          uStack_35c8 = auVar21._56_8_;
          uStack_2a48 = uStack_35c8;
          *local_2a08 = local_3600;
          local_2a08[1] = uStack_35f8;
          local_2a08[2] = uStack_35f0;
          local_2a08[3] = uStack_35e8;
          local_2a08[4] = uStack_35e0;
          local_2a08[5] = uStack_35d8;
          local_2a08[6] = uStack_35d0;
          local_2a08[7] = uStack_35c8;
          local_3378 = local_3378 + 4;
        }
      }
      else if (iVar1 == local_3354 + 2) {
        local_3338 = local_3348;
        local_3340 = local_3350;
        local_3348 = pauVar14;
        local_3350 = pauVar13;
        local_310c = iVar1 + 1;
        local_3108 = local_31d0;
        lVar4 = *local_31d0;
        iVar2 = *(int *)((long)local_31d0 + 0x2c);
        lVar5 = local_31d0[2];
        local_311c = iVar1 + 2;
        local_3118 = local_31d0;
        lVar6 = *local_31d0;
        iVar3 = *(int *)((long)local_31d0 + 0x2c);
        lVar7 = local_31d0[2];
        local_3628 = local_31e0;
        for (local_363c = 0; local_363c < local_31fc; local_363c = local_363c + 1) {
          iVar15 = *(int *)(local_31e8 + (long)local_363c * 4) << 4;
          local_2fb0 = (undefined1 (*) [64])
                       (lVar4 + (long)iVar2 * (long)local_310c * lVar5 + (long)iVar15 * 4);
          local_2fd0 = (undefined1 (*) [64])
                       (lVar6 + (long)iVar3 * (long)local_311c * lVar7 + (long)iVar15 * 4);
          local_2204 = *local_3628;
          local_2280 = vbroadcastss_avx512f(ZEXT416(local_2204));
          local_2284 = local_3628[1];
          local_2300 = vbroadcastss_avx512f(ZEXT416(local_2284));
          local_2304 = local_3628[2];
          local_2380 = vbroadcastss_avx512f(ZEXT416(local_2304));
          local_2384 = local_3628[3];
          local_2400 = vbroadcastss_avx512f(ZEXT416(local_2384));
          local_2fa8 = local_2fb0 + -1;
          local_1b40 = *(undefined8 *)*local_2fa8;
          uStack_1b38 = *(undefined8 *)(local_2fb0[-1] + 8);
          uStack_1b30 = *(undefined8 *)(local_2fb0[-1] + 0x10);
          uStack_1b28 = *(undefined8 *)(local_2fb0[-1] + 0x18);
          uStack_1b20 = *(undefined8 *)(local_2fb0[-1] + 0x20);
          uStack_1b18 = *(undefined8 *)(local_2fb0[-1] + 0x28);
          uStack_1b10 = *(undefined8 *)(local_2fb0[-1] + 0x30);
          uStack_1b08 = *(undefined8 *)(local_2fb0[-1] + 0x38);
          local_440 = *(undefined8 *)*local_2fb0;
          uStack_438 = *(undefined8 *)(*local_2fb0 + 8);
          uStack_430 = *(undefined8 *)(*local_2fb0 + 0x10);
          uStack_428 = *(undefined8 *)(*local_2fb0 + 0x18);
          uStack_420 = *(undefined8 *)(*local_2fb0 + 0x20);
          uStack_418 = *(undefined8 *)(*local_2fb0 + 0x28);
          uStack_410 = *(undefined8 *)(*local_2fb0 + 0x30);
          uStack_408 = *(undefined8 *)(*local_2fb0 + 0x38);
          local_2fb8 = local_2fb0 + 1;
          local_5c0 = *(undefined8 *)*local_2fb8;
          uStack_5b8 = *(undefined8 *)(local_2fb0[1] + 8);
          uStack_5b0 = *(undefined8 *)(local_2fb0[1] + 0x10);
          uStack_5a8 = *(undefined8 *)(local_2fb0[1] + 0x18);
          uStack_5a0 = *(undefined8 *)(local_2fb0[1] + 0x20);
          uStack_598 = *(undefined8 *)(local_2fb0[1] + 0x28);
          uStack_590 = *(undefined8 *)(local_2fb0[1] + 0x30);
          uStack_588 = *(undefined8 *)(local_2fb0[1] + 0x38);
          local_2fc0 = local_2fb0 + 2;
          local_740 = *(undefined8 *)*local_2fc0;
          uStack_738 = *(undefined8 *)(local_2fb0[2] + 8);
          uStack_730 = *(undefined8 *)(local_2fb0[2] + 0x10);
          uStack_728 = *(undefined8 *)(local_2fb0[2] + 0x18);
          uStack_720 = *(undefined8 *)(local_2fb0[2] + 0x20);
          uStack_718 = *(undefined8 *)(local_2fb0[2] + 0x28);
          uStack_710 = *(undefined8 *)(local_2fb0[2] + 0x30);
          uStack_708 = *(undefined8 *)(local_2fb0[2] + 0x38);
          local_2fc8 = local_2fd0 + -1;
          local_1bc0 = *(undefined8 *)*local_2fc8;
          uStack_1bb8 = *(undefined8 *)(local_2fd0[-1] + 8);
          uStack_1bb0 = *(undefined8 *)(local_2fd0[-1] + 0x10);
          uStack_1ba8 = *(undefined8 *)(local_2fd0[-1] + 0x18);
          uStack_1ba0 = *(undefined8 *)(local_2fd0[-1] + 0x20);
          uStack_1b98 = *(undefined8 *)(local_2fd0[-1] + 0x28);
          uStack_1b90 = *(undefined8 *)(local_2fd0[-1] + 0x30);
          uStack_1b88 = *(undefined8 *)(local_2fd0[-1] + 0x38);
          local_500 = *(undefined8 *)*local_2fd0;
          uStack_4f8 = *(undefined8 *)(*local_2fd0 + 8);
          uStack_4f0 = *(undefined8 *)(*local_2fd0 + 0x10);
          uStack_4e8 = *(undefined8 *)(*local_2fd0 + 0x18);
          uStack_4e0 = *(undefined8 *)(*local_2fd0 + 0x20);
          uStack_4d8 = *(undefined8 *)(*local_2fd0 + 0x28);
          uStack_4d0 = *(undefined8 *)(*local_2fd0 + 0x30);
          uStack_4c8 = *(undefined8 *)(*local_2fd0 + 0x38);
          local_2fd8 = local_2fd0 + 1;
          local_680 = *(undefined8 *)*local_2fd8;
          uStack_678 = *(undefined8 *)(local_2fd0[1] + 8);
          uStack_670 = *(undefined8 *)(local_2fd0[1] + 0x10);
          uStack_668 = *(undefined8 *)(local_2fd0[1] + 0x18);
          uStack_660 = *(undefined8 *)(local_2fd0[1] + 0x20);
          uStack_658 = *(undefined8 *)(local_2fd0[1] + 0x28);
          uStack_650 = *(undefined8 *)(local_2fd0[1] + 0x30);
          uStack_648 = *(undefined8 *)(local_2fd0[1] + 0x38);
          local_2fe0 = local_2fd0 + 2;
          local_800 = *(undefined8 *)*local_2fe0;
          uStack_7f8 = *(undefined8 *)(local_2fd0[2] + 8);
          uStack_7f0 = *(undefined8 *)(local_2fd0[2] + 0x10);
          uStack_7e8 = *(undefined8 *)(local_2fd0[2] + 0x18);
          uStack_7e0 = *(undefined8 *)(local_2fd0[2] + 0x20);
          uStack_7d8 = *(undefined8 *)(local_2fd0[2] + 0x28);
          uStack_7d0 = *(undefined8 *)(local_2fd0[2] + 0x30);
          uStack_7c8 = *(undefined8 *)(local_2fd0[2] + 0x38);
          local_1b80 = local_2280._0_8_;
          uStack_1b78 = local_2280._8_8_;
          uStack_1b70 = local_2280._16_8_;
          uStack_1b68 = local_2280._24_8_;
          uStack_1b60 = local_2280._32_8_;
          uStack_1b58 = local_2280._40_8_;
          uStack_1b50 = local_2280._48_8_;
          uStack_1b48 = local_2280._56_8_;
          auVar21 = vmulps_avx512f(*local_2fa8,local_2280);
          local_1c00 = local_2280._0_8_;
          uStack_1bf8 = local_2280._8_8_;
          uStack_1bf0 = local_2280._16_8_;
          uStack_1be8 = local_2280._24_8_;
          uStack_1be0 = local_2280._32_8_;
          uStack_1bd8 = local_2280._40_8_;
          uStack_1bd0 = local_2280._48_8_;
          uStack_1bc8 = local_2280._56_8_;
          auVar18 = vmulps_avx512f(*local_2fc8,local_2280);
          local_480 = local_2300._0_8_;
          uStack_478 = local_2300._8_8_;
          uStack_470 = local_2300._16_8_;
          uStack_468 = local_2300._24_8_;
          uStack_460 = local_2300._32_8_;
          uStack_458 = local_2300._40_8_;
          uStack_450 = local_2300._48_8_;
          uStack_448 = local_2300._56_8_;
          local_39c0 = auVar21._0_8_;
          local_4c0 = local_39c0;
          uStack_39b8 = auVar21._8_8_;
          uStack_4b8 = uStack_39b8;
          uStack_39b0 = auVar21._16_8_;
          uStack_4b0 = uStack_39b0;
          uStack_39a8 = auVar21._24_8_;
          uStack_4a8 = uStack_39a8;
          uStack_39a0 = auVar21._32_8_;
          uStack_4a0 = uStack_39a0;
          uStack_3998 = auVar21._40_8_;
          uStack_498 = uStack_3998;
          uStack_3990 = auVar21._48_8_;
          uStack_490 = uStack_3990;
          uStack_3988 = auVar21._56_8_;
          uStack_488 = uStack_3988;
          auVar21 = vfmadd213ps_avx512f(local_2300,*local_2fb0,auVar21);
          local_540 = local_2300._0_8_;
          uStack_538 = local_2300._8_8_;
          uStack_530 = local_2300._16_8_;
          uStack_528 = local_2300._24_8_;
          uStack_520 = local_2300._32_8_;
          uStack_518 = local_2300._40_8_;
          uStack_510 = local_2300._48_8_;
          uStack_508 = local_2300._56_8_;
          local_3a00 = auVar18._0_8_;
          local_580 = local_3a00;
          uStack_39f8 = auVar18._8_8_;
          uStack_578 = uStack_39f8;
          uStack_39f0 = auVar18._16_8_;
          uStack_570 = uStack_39f0;
          uStack_39e8 = auVar18._24_8_;
          uStack_568 = uStack_39e8;
          uStack_39e0 = auVar18._32_8_;
          uStack_560 = uStack_39e0;
          uStack_39d8 = auVar18._40_8_;
          uStack_558 = uStack_39d8;
          uStack_39d0 = auVar18._48_8_;
          uStack_550 = uStack_39d0;
          uStack_39c8 = auVar18._56_8_;
          uStack_548 = uStack_39c8;
          auVar18 = vfmadd213ps_avx512f(local_2300,*local_2fd0,auVar18);
          local_600 = local_2380._0_8_;
          uStack_5f8 = local_2380._8_8_;
          uStack_5f0 = local_2380._16_8_;
          uStack_5e8 = local_2380._24_8_;
          uStack_5e0 = local_2380._32_8_;
          uStack_5d8 = local_2380._40_8_;
          uStack_5d0 = local_2380._48_8_;
          uStack_5c8 = local_2380._56_8_;
          local_39c0 = auVar21._0_8_;
          local_640 = local_39c0;
          uStack_39b8 = auVar21._8_8_;
          uStack_638 = uStack_39b8;
          uStack_39b0 = auVar21._16_8_;
          uStack_630 = uStack_39b0;
          uStack_39a8 = auVar21._24_8_;
          uStack_628 = uStack_39a8;
          uStack_39a0 = auVar21._32_8_;
          uStack_620 = uStack_39a0;
          uStack_3998 = auVar21._40_8_;
          uStack_618 = uStack_3998;
          uStack_3990 = auVar21._48_8_;
          uStack_610 = uStack_3990;
          uStack_3988 = auVar21._56_8_;
          uStack_608 = uStack_3988;
          auVar21 = vfmadd213ps_avx512f(local_2380,*local_2fb8,auVar21);
          local_6c0 = local_2380._0_8_;
          uStack_6b8 = local_2380._8_8_;
          uStack_6b0 = local_2380._16_8_;
          uStack_6a8 = local_2380._24_8_;
          uStack_6a0 = local_2380._32_8_;
          uStack_698 = local_2380._40_8_;
          uStack_690 = local_2380._48_8_;
          uStack_688 = local_2380._56_8_;
          local_3a00 = auVar18._0_8_;
          local_700 = local_3a00;
          uStack_39f8 = auVar18._8_8_;
          uStack_6f8 = uStack_39f8;
          uStack_39f0 = auVar18._16_8_;
          uStack_6f0 = uStack_39f0;
          uStack_39e8 = auVar18._24_8_;
          uStack_6e8 = uStack_39e8;
          uStack_39e0 = auVar18._32_8_;
          uStack_6e0 = uStack_39e0;
          uStack_39d8 = auVar18._40_8_;
          uStack_6d8 = uStack_39d8;
          uStack_39d0 = auVar18._48_8_;
          uStack_6d0 = uStack_39d0;
          uStack_39c8 = auVar18._56_8_;
          uStack_6c8 = uStack_39c8;
          auVar18 = vfmadd213ps_avx512f(local_2380,*local_2fd8,auVar18);
          local_780 = local_2400._0_8_;
          uStack_778 = local_2400._8_8_;
          uStack_770 = local_2400._16_8_;
          uStack_768 = local_2400._24_8_;
          uStack_760 = local_2400._32_8_;
          uStack_758 = local_2400._40_8_;
          uStack_750 = local_2400._48_8_;
          uStack_748 = local_2400._56_8_;
          local_39c0 = auVar21._0_8_;
          local_7c0 = local_39c0;
          uStack_39b8 = auVar21._8_8_;
          uStack_7b8 = uStack_39b8;
          uStack_39b0 = auVar21._16_8_;
          uStack_7b0 = uStack_39b0;
          uStack_39a8 = auVar21._24_8_;
          uStack_7a8 = uStack_39a8;
          uStack_39a0 = auVar21._32_8_;
          uStack_7a0 = uStack_39a0;
          uStack_3998 = auVar21._40_8_;
          uStack_798 = uStack_3998;
          uStack_3990 = auVar21._48_8_;
          uStack_790 = uStack_3990;
          uStack_3988 = auVar21._56_8_;
          uStack_788 = uStack_3988;
          auVar21 = vfmadd213ps_avx512f(local_2400,*local_2fc0,auVar21);
          local_840 = local_2400._0_8_;
          uStack_838 = local_2400._8_8_;
          uStack_830 = local_2400._16_8_;
          uStack_828 = local_2400._24_8_;
          uStack_820 = local_2400._32_8_;
          uStack_818 = local_2400._40_8_;
          uStack_810 = local_2400._48_8_;
          uStack_808 = local_2400._56_8_;
          local_3a00 = auVar18._0_8_;
          local_880 = local_3a00;
          uStack_39f8 = auVar18._8_8_;
          uStack_878 = uStack_39f8;
          uStack_39f0 = auVar18._16_8_;
          uStack_870 = uStack_39f0;
          uStack_39e8 = auVar18._24_8_;
          uStack_868 = uStack_39e8;
          uStack_39e0 = auVar18._32_8_;
          uStack_860 = uStack_39e0;
          uStack_39d8 = auVar18._40_8_;
          uStack_858 = uStack_39d8;
          uStack_39d0 = auVar18._48_8_;
          uStack_850 = uStack_39d0;
          uStack_39c8 = auVar18._56_8_;
          uStack_848 = uStack_39c8;
          auVar18 = vfmadd213ps_avx512f(local_2400,*local_2fe0,auVar18);
          local_2a88 = (undefined8 *)(*pauVar14 + (long)(local_363c << 4) * 4);
          local_39c0 = auVar21._0_8_;
          local_2b00 = local_39c0;
          uStack_39b8 = auVar21._8_8_;
          uStack_2af8 = uStack_39b8;
          uStack_39b0 = auVar21._16_8_;
          uStack_2af0 = uStack_39b0;
          uStack_39a8 = auVar21._24_8_;
          uStack_2ae8 = uStack_39a8;
          uStack_39a0 = auVar21._32_8_;
          uStack_2ae0 = uStack_39a0;
          uStack_3998 = auVar21._40_8_;
          uStack_2ad8 = uStack_3998;
          uStack_3990 = auVar21._48_8_;
          uStack_2ad0 = uStack_3990;
          uStack_3988 = auVar21._56_8_;
          uStack_2ac8 = uStack_3988;
          *local_2a88 = local_39c0;
          local_2a88[1] = uStack_39b8;
          local_2a88[2] = uStack_39b0;
          local_2a88[3] = uStack_39a8;
          local_2a88[4] = uStack_39a0;
          local_2a88[5] = uStack_3998;
          local_2a88[6] = uStack_3990;
          local_2a88[7] = uStack_3988;
          local_2b08 = (undefined8 *)(*pauVar13 + (long)(local_363c << 4) * 4);
          local_3a00 = auVar18._0_8_;
          local_2b80 = local_3a00;
          uStack_39f8 = auVar18._8_8_;
          uStack_2b78 = uStack_39f8;
          uStack_39f0 = auVar18._16_8_;
          uStack_2b70 = uStack_39f0;
          uStack_39e8 = auVar18._24_8_;
          uStack_2b68 = uStack_39e8;
          uStack_39e0 = auVar18._32_8_;
          uStack_2b60 = uStack_39e0;
          uStack_39d8 = auVar18._40_8_;
          uStack_2b58 = uStack_39d8;
          uStack_39d0 = auVar18._48_8_;
          uStack_2b50 = uStack_39d0;
          uStack_39c8 = auVar18._56_8_;
          uStack_2b48 = uStack_39c8;
          *local_2b08 = local_3a00;
          local_2b08[1] = uStack_39f8;
          local_2b08[2] = uStack_39f0;
          local_2b08[3] = uStack_39e8;
          local_2b08[4] = uStack_39e0;
          local_2b08[5] = uStack_39d8;
          local_2b08[6] = uStack_39d0;
          local_2b08[7] = uStack_39c8;
          local_3628 = local_3628 + 4;
        }
      }
      else if (iVar1 == local_3354 + 3) {
        local_3338 = local_3350;
        local_3340 = pauVar14;
        local_3348 = pauVar13;
        local_3350 = pauVar12;
        local_3128 = local_31d0;
        lVar4 = *local_31d0;
        iVar2 = *(int *)((long)local_31d0 + 0x2c);
        lVar5 = local_31d0[2];
        local_313c = iVar1 + 1;
        local_3138 = local_31d0;
        lVar6 = *local_31d0;
        iVar3 = *(int *)((long)local_31d0 + 0x2c);
        lVar7 = local_31d0[2];
        local_314c = iVar1 + 2;
        local_3148 = local_31d0;
        lVar8 = *local_31d0;
        iVar15 = *(int *)((long)local_31d0 + 0x2c);
        lVar9 = local_31d0[2];
        local_3a38 = local_31e0;
        for (local_3a54 = 0; local_312c = iVar1, local_3a54 < local_31fc;
            local_3a54 = local_3a54 + 1) {
          iVar16 = *(int *)(local_31e8 + (long)local_3a54 * 4) << 4;
          local_2ff0 = (undefined1 (*) [64])
                       (lVar4 + (long)iVar2 * (long)iVar1 * lVar5 + (long)iVar16 * 4);
          local_3010 = (undefined1 (*) [64])
                       (lVar6 + (long)iVar3 * (long)local_313c * lVar7 + (long)iVar16 * 4);
          local_3030 = (undefined1 (*) [64])
                       (lVar8 + (long)iVar15 * (long)local_314c * lVar9 + (long)iVar16 * 4);
          local_2404 = *local_3a38;
          local_2480 = vbroadcastss_avx512f(ZEXT416(local_2404));
          local_2484 = local_3a38[1];
          local_2500 = vbroadcastss_avx512f(ZEXT416(local_2484));
          local_2504 = local_3a38[2];
          local_2580 = vbroadcastss_avx512f(ZEXT416(local_2504));
          local_2584 = local_3a38[3];
          local_2600 = vbroadcastss_avx512f(ZEXT416(local_2584));
          local_2fe8 = local_2ff0 + -1;
          local_1c40 = *(undefined8 *)*local_2fe8;
          uStack_1c38 = *(undefined8 *)(local_2ff0[-1] + 8);
          uStack_1c30 = *(undefined8 *)(local_2ff0[-1] + 0x10);
          uStack_1c28 = *(undefined8 *)(local_2ff0[-1] + 0x18);
          uStack_1c20 = *(undefined8 *)(local_2ff0[-1] + 0x20);
          uStack_1c18 = *(undefined8 *)(local_2ff0[-1] + 0x28);
          uStack_1c10 = *(undefined8 *)(local_2ff0[-1] + 0x30);
          uStack_1c08 = *(undefined8 *)(local_2ff0[-1] + 0x38);
          local_8c0 = *(undefined8 *)*local_2ff0;
          uStack_8b8 = *(undefined8 *)(*local_2ff0 + 8);
          uStack_8b0 = *(undefined8 *)(*local_2ff0 + 0x10);
          uStack_8a8 = *(undefined8 *)(*local_2ff0 + 0x18);
          uStack_8a0 = *(undefined8 *)(*local_2ff0 + 0x20);
          uStack_898 = *(undefined8 *)(*local_2ff0 + 0x28);
          uStack_890 = *(undefined8 *)(*local_2ff0 + 0x30);
          uStack_888 = *(undefined8 *)(*local_2ff0 + 0x38);
          local_2ff8 = local_2ff0 + 1;
          local_b00 = *(undefined8 *)*local_2ff8;
          uStack_af8 = *(undefined8 *)(local_2ff0[1] + 8);
          uStack_af0 = *(undefined8 *)(local_2ff0[1] + 0x10);
          uStack_ae8 = *(undefined8 *)(local_2ff0[1] + 0x18);
          uStack_ae0 = *(undefined8 *)(local_2ff0[1] + 0x20);
          uStack_ad8 = *(undefined8 *)(local_2ff0[1] + 0x28);
          uStack_ad0 = *(undefined8 *)(local_2ff0[1] + 0x30);
          uStack_ac8 = *(undefined8 *)(local_2ff0[1] + 0x38);
          local_3000 = local_2ff0 + 2;
          local_d40 = *(undefined8 *)*local_3000;
          uStack_d38 = *(undefined8 *)(local_2ff0[2] + 8);
          uStack_d30 = *(undefined8 *)(local_2ff0[2] + 0x10);
          uStack_d28 = *(undefined8 *)(local_2ff0[2] + 0x18);
          uStack_d20 = *(undefined8 *)(local_2ff0[2] + 0x20);
          uStack_d18 = *(undefined8 *)(local_2ff0[2] + 0x28);
          uStack_d10 = *(undefined8 *)(local_2ff0[2] + 0x30);
          uStack_d08 = *(undefined8 *)(local_2ff0[2] + 0x38);
          local_3008 = local_3010 + -1;
          local_1cc0 = *(undefined8 *)*local_3008;
          uStack_1cb8 = *(undefined8 *)(local_3010[-1] + 8);
          uStack_1cb0 = *(undefined8 *)(local_3010[-1] + 0x10);
          uStack_1ca8 = *(undefined8 *)(local_3010[-1] + 0x18);
          uStack_1ca0 = *(undefined8 *)(local_3010[-1] + 0x20);
          uStack_1c98 = *(undefined8 *)(local_3010[-1] + 0x28);
          uStack_1c90 = *(undefined8 *)(local_3010[-1] + 0x30);
          uStack_1c88 = *(undefined8 *)(local_3010[-1] + 0x38);
          local_980 = *(undefined8 *)*local_3010;
          uStack_978 = *(undefined8 *)(*local_3010 + 8);
          uStack_970 = *(undefined8 *)(*local_3010 + 0x10);
          uStack_968 = *(undefined8 *)(*local_3010 + 0x18);
          uStack_960 = *(undefined8 *)(*local_3010 + 0x20);
          uStack_958 = *(undefined8 *)(*local_3010 + 0x28);
          uStack_950 = *(undefined8 *)(*local_3010 + 0x30);
          uStack_948 = *(undefined8 *)(*local_3010 + 0x38);
          local_3018 = local_3010 + 1;
          local_bc0 = *(undefined8 *)*local_3018;
          uStack_bb8 = *(undefined8 *)(local_3010[1] + 8);
          uStack_bb0 = *(undefined8 *)(local_3010[1] + 0x10);
          uStack_ba8 = *(undefined8 *)(local_3010[1] + 0x18);
          uStack_ba0 = *(undefined8 *)(local_3010[1] + 0x20);
          uStack_b98 = *(undefined8 *)(local_3010[1] + 0x28);
          uStack_b90 = *(undefined8 *)(local_3010[1] + 0x30);
          uStack_b88 = *(undefined8 *)(local_3010[1] + 0x38);
          local_3020 = local_3010 + 2;
          local_e00 = *(undefined8 *)*local_3020;
          uStack_df8 = *(undefined8 *)(local_3010[2] + 8);
          uStack_df0 = *(undefined8 *)(local_3010[2] + 0x10);
          uStack_de8 = *(undefined8 *)(local_3010[2] + 0x18);
          uStack_de0 = *(undefined8 *)(local_3010[2] + 0x20);
          uStack_dd8 = *(undefined8 *)(local_3010[2] + 0x28);
          uStack_dd0 = *(undefined8 *)(local_3010[2] + 0x30);
          uStack_dc8 = *(undefined8 *)(local_3010[2] + 0x38);
          local_3028 = local_3030 + -1;
          local_1d40 = *(undefined8 *)*local_3028;
          uStack_1d38 = *(undefined8 *)(local_3030[-1] + 8);
          uStack_1d30 = *(undefined8 *)(local_3030[-1] + 0x10);
          uStack_1d28 = *(undefined8 *)(local_3030[-1] + 0x18);
          uStack_1d20 = *(undefined8 *)(local_3030[-1] + 0x20);
          uStack_1d18 = *(undefined8 *)(local_3030[-1] + 0x28);
          uStack_1d10 = *(undefined8 *)(local_3030[-1] + 0x30);
          uStack_1d08 = *(undefined8 *)(local_3030[-1] + 0x38);
          local_a40 = *(undefined8 *)*local_3030;
          uStack_a38 = *(undefined8 *)(*local_3030 + 8);
          uStack_a30 = *(undefined8 *)(*local_3030 + 0x10);
          uStack_a28 = *(undefined8 *)(*local_3030 + 0x18);
          uStack_a20 = *(undefined8 *)(*local_3030 + 0x20);
          uStack_a18 = *(undefined8 *)(*local_3030 + 0x28);
          uStack_a10 = *(undefined8 *)(*local_3030 + 0x30);
          uStack_a08 = *(undefined8 *)(*local_3030 + 0x38);
          local_3038 = local_3030 + 1;
          local_c80 = *(undefined8 *)*local_3038;
          uStack_c78 = *(undefined8 *)(local_3030[1] + 8);
          uStack_c70 = *(undefined8 *)(local_3030[1] + 0x10);
          uStack_c68 = *(undefined8 *)(local_3030[1] + 0x18);
          uStack_c60 = *(undefined8 *)(local_3030[1] + 0x20);
          uStack_c58 = *(undefined8 *)(local_3030[1] + 0x28);
          uStack_c50 = *(undefined8 *)(local_3030[1] + 0x30);
          uStack_c48 = *(undefined8 *)(local_3030[1] + 0x38);
          local_3040 = local_3030 + 2;
          local_ec0 = *(undefined8 *)*local_3040;
          uStack_eb8 = *(undefined8 *)(local_3030[2] + 8);
          uStack_eb0 = *(undefined8 *)(local_3030[2] + 0x10);
          uStack_ea8 = *(undefined8 *)(local_3030[2] + 0x18);
          uStack_ea0 = *(undefined8 *)(local_3030[2] + 0x20);
          uStack_e98 = *(undefined8 *)(local_3030[2] + 0x28);
          uStack_e90 = *(undefined8 *)(local_3030[2] + 0x30);
          uStack_e88 = *(undefined8 *)(local_3030[2] + 0x38);
          local_1c80 = local_2480._0_8_;
          uStack_1c78 = local_2480._8_8_;
          uStack_1c70 = local_2480._16_8_;
          uStack_1c68 = local_2480._24_8_;
          uStack_1c60 = local_2480._32_8_;
          uStack_1c58 = local_2480._40_8_;
          uStack_1c50 = local_2480._48_8_;
          uStack_1c48 = local_2480._56_8_;
          auVar21 = vmulps_avx512f(*local_2fe8,local_2480);
          local_1d00 = local_2480._0_8_;
          uStack_1cf8 = local_2480._8_8_;
          uStack_1cf0 = local_2480._16_8_;
          uStack_1ce8 = local_2480._24_8_;
          uStack_1ce0 = local_2480._32_8_;
          uStack_1cd8 = local_2480._40_8_;
          uStack_1cd0 = local_2480._48_8_;
          uStack_1cc8 = local_2480._56_8_;
          auVar18 = vmulps_avx512f(*local_3008,local_2480);
          local_1d80 = local_2480._0_8_;
          uStack_1d78 = local_2480._8_8_;
          uStack_1d70 = local_2480._16_8_;
          uStack_1d68 = local_2480._24_8_;
          uStack_1d60 = local_2480._32_8_;
          uStack_1d58 = local_2480._40_8_;
          uStack_1d50 = local_2480._48_8_;
          uStack_1d48 = local_2480._56_8_;
          auVar19 = vmulps_avx512f(*local_3028,local_2480);
          local_900 = local_2500._0_8_;
          uStack_8f8 = local_2500._8_8_;
          uStack_8f0 = local_2500._16_8_;
          uStack_8e8 = local_2500._24_8_;
          uStack_8e0 = local_2500._32_8_;
          uStack_8d8 = local_2500._40_8_;
          uStack_8d0 = local_2500._48_8_;
          uStack_8c8 = local_2500._56_8_;
          local_3ec0 = auVar21._0_8_;
          local_940 = local_3ec0;
          uStack_3eb8 = auVar21._8_8_;
          uStack_938 = uStack_3eb8;
          uStack_3eb0 = auVar21._16_8_;
          uStack_930 = uStack_3eb0;
          uStack_3ea8 = auVar21._24_8_;
          uStack_928 = uStack_3ea8;
          uStack_3ea0 = auVar21._32_8_;
          uStack_920 = uStack_3ea0;
          uStack_3e98 = auVar21._40_8_;
          uStack_918 = uStack_3e98;
          uStack_3e90 = auVar21._48_8_;
          uStack_910 = uStack_3e90;
          uStack_3e88 = auVar21._56_8_;
          uStack_908 = uStack_3e88;
          auVar21 = vfmadd213ps_avx512f(local_2500,*local_2ff0,auVar21);
          local_9c0 = local_2500._0_8_;
          uStack_9b8 = local_2500._8_8_;
          uStack_9b0 = local_2500._16_8_;
          uStack_9a8 = local_2500._24_8_;
          uStack_9a0 = local_2500._32_8_;
          uStack_998 = local_2500._40_8_;
          uStack_990 = local_2500._48_8_;
          uStack_988 = local_2500._56_8_;
          local_3f00 = auVar18._0_8_;
          local_a00 = local_3f00;
          uStack_3ef8 = auVar18._8_8_;
          uStack_9f8 = uStack_3ef8;
          uStack_3ef0 = auVar18._16_8_;
          uStack_9f0 = uStack_3ef0;
          uStack_3ee8 = auVar18._24_8_;
          uStack_9e8 = uStack_3ee8;
          uStack_3ee0 = auVar18._32_8_;
          uStack_9e0 = uStack_3ee0;
          uStack_3ed8 = auVar18._40_8_;
          uStack_9d8 = uStack_3ed8;
          uStack_3ed0 = auVar18._48_8_;
          uStack_9d0 = uStack_3ed0;
          uStack_3ec8 = auVar18._56_8_;
          uStack_9c8 = uStack_3ec8;
          auVar18 = vfmadd213ps_avx512f(local_2500,*local_3010,auVar18);
          local_a80 = local_2500._0_8_;
          uStack_a78 = local_2500._8_8_;
          uStack_a70 = local_2500._16_8_;
          uStack_a68 = local_2500._24_8_;
          uStack_a60 = local_2500._32_8_;
          uStack_a58 = local_2500._40_8_;
          uStack_a50 = local_2500._48_8_;
          uStack_a48 = local_2500._56_8_;
          local_3f40 = auVar19._0_8_;
          local_ac0 = local_3f40;
          uStack_3f38 = auVar19._8_8_;
          uStack_ab8 = uStack_3f38;
          uStack_3f30 = auVar19._16_8_;
          uStack_ab0 = uStack_3f30;
          uStack_3f28 = auVar19._24_8_;
          uStack_aa8 = uStack_3f28;
          uStack_3f20 = auVar19._32_8_;
          uStack_aa0 = uStack_3f20;
          uStack_3f18 = auVar19._40_8_;
          uStack_a98 = uStack_3f18;
          uStack_3f10 = auVar19._48_8_;
          uStack_a90 = uStack_3f10;
          uStack_3f08 = auVar19._56_8_;
          uStack_a88 = uStack_3f08;
          auVar19 = vfmadd213ps_avx512f(local_2500,*local_3030,auVar19);
          local_b40 = local_2580._0_8_;
          uStack_b38 = local_2580._8_8_;
          uStack_b30 = local_2580._16_8_;
          uStack_b28 = local_2580._24_8_;
          uStack_b20 = local_2580._32_8_;
          uStack_b18 = local_2580._40_8_;
          uStack_b10 = local_2580._48_8_;
          uStack_b08 = local_2580._56_8_;
          local_3ec0 = auVar21._0_8_;
          local_b80 = local_3ec0;
          uStack_3eb8 = auVar21._8_8_;
          uStack_b78 = uStack_3eb8;
          uStack_3eb0 = auVar21._16_8_;
          uStack_b70 = uStack_3eb0;
          uStack_3ea8 = auVar21._24_8_;
          uStack_b68 = uStack_3ea8;
          uStack_3ea0 = auVar21._32_8_;
          uStack_b60 = uStack_3ea0;
          uStack_3e98 = auVar21._40_8_;
          uStack_b58 = uStack_3e98;
          uStack_3e90 = auVar21._48_8_;
          uStack_b50 = uStack_3e90;
          uStack_3e88 = auVar21._56_8_;
          uStack_b48 = uStack_3e88;
          auVar21 = vfmadd213ps_avx512f(local_2580,*local_2ff8,auVar21);
          local_c00 = local_2580._0_8_;
          uStack_bf8 = local_2580._8_8_;
          uStack_bf0 = local_2580._16_8_;
          uStack_be8 = local_2580._24_8_;
          uStack_be0 = local_2580._32_8_;
          uStack_bd8 = local_2580._40_8_;
          uStack_bd0 = local_2580._48_8_;
          uStack_bc8 = local_2580._56_8_;
          local_3f00 = auVar18._0_8_;
          local_c40 = local_3f00;
          uStack_3ef8 = auVar18._8_8_;
          uStack_c38 = uStack_3ef8;
          uStack_3ef0 = auVar18._16_8_;
          uStack_c30 = uStack_3ef0;
          uStack_3ee8 = auVar18._24_8_;
          uStack_c28 = uStack_3ee8;
          uStack_3ee0 = auVar18._32_8_;
          uStack_c20 = uStack_3ee0;
          uStack_3ed8 = auVar18._40_8_;
          uStack_c18 = uStack_3ed8;
          uStack_3ed0 = auVar18._48_8_;
          uStack_c10 = uStack_3ed0;
          uStack_3ec8 = auVar18._56_8_;
          uStack_c08 = uStack_3ec8;
          auVar18 = vfmadd213ps_avx512f(local_2580,*local_3018,auVar18);
          local_cc0 = local_2580._0_8_;
          uStack_cb8 = local_2580._8_8_;
          uStack_cb0 = local_2580._16_8_;
          uStack_ca8 = local_2580._24_8_;
          uStack_ca0 = local_2580._32_8_;
          uStack_c98 = local_2580._40_8_;
          uStack_c90 = local_2580._48_8_;
          uStack_c88 = local_2580._56_8_;
          local_3f40 = auVar19._0_8_;
          local_d00 = local_3f40;
          uStack_3f38 = auVar19._8_8_;
          uStack_cf8 = uStack_3f38;
          uStack_3f30 = auVar19._16_8_;
          uStack_cf0 = uStack_3f30;
          uStack_3f28 = auVar19._24_8_;
          uStack_ce8 = uStack_3f28;
          uStack_3f20 = auVar19._32_8_;
          uStack_ce0 = uStack_3f20;
          uStack_3f18 = auVar19._40_8_;
          uStack_cd8 = uStack_3f18;
          uStack_3f10 = auVar19._48_8_;
          uStack_cd0 = uStack_3f10;
          uStack_3f08 = auVar19._56_8_;
          uStack_cc8 = uStack_3f08;
          auVar19 = vfmadd213ps_avx512f(local_2580,*local_3038,auVar19);
          local_d80 = local_2600._0_8_;
          uStack_d78 = local_2600._8_8_;
          uStack_d70 = local_2600._16_8_;
          uStack_d68 = local_2600._24_8_;
          uStack_d60 = local_2600._32_8_;
          uStack_d58 = local_2600._40_8_;
          uStack_d50 = local_2600._48_8_;
          uStack_d48 = local_2600._56_8_;
          local_3ec0 = auVar21._0_8_;
          local_dc0 = local_3ec0;
          uStack_3eb8 = auVar21._8_8_;
          uStack_db8 = uStack_3eb8;
          uStack_3eb0 = auVar21._16_8_;
          uStack_db0 = uStack_3eb0;
          uStack_3ea8 = auVar21._24_8_;
          uStack_da8 = uStack_3ea8;
          uStack_3ea0 = auVar21._32_8_;
          uStack_da0 = uStack_3ea0;
          uStack_3e98 = auVar21._40_8_;
          uStack_d98 = uStack_3e98;
          uStack_3e90 = auVar21._48_8_;
          uStack_d90 = uStack_3e90;
          uStack_3e88 = auVar21._56_8_;
          uStack_d88 = uStack_3e88;
          auVar21 = vfmadd213ps_avx512f(local_2600,*local_3000,auVar21);
          local_e40 = local_2600._0_8_;
          uStack_e38 = local_2600._8_8_;
          uStack_e30 = local_2600._16_8_;
          uStack_e28 = local_2600._24_8_;
          uStack_e20 = local_2600._32_8_;
          uStack_e18 = local_2600._40_8_;
          uStack_e10 = local_2600._48_8_;
          uStack_e08 = local_2600._56_8_;
          local_3f00 = auVar18._0_8_;
          local_e80 = local_3f00;
          uStack_3ef8 = auVar18._8_8_;
          uStack_e78 = uStack_3ef8;
          uStack_3ef0 = auVar18._16_8_;
          uStack_e70 = uStack_3ef0;
          uStack_3ee8 = auVar18._24_8_;
          uStack_e68 = uStack_3ee8;
          uStack_3ee0 = auVar18._32_8_;
          uStack_e60 = uStack_3ee0;
          uStack_3ed8 = auVar18._40_8_;
          uStack_e58 = uStack_3ed8;
          uStack_3ed0 = auVar18._48_8_;
          uStack_e50 = uStack_3ed0;
          uStack_3ec8 = auVar18._56_8_;
          uStack_e48 = uStack_3ec8;
          auVar18 = vfmadd213ps_avx512f(local_2600,*local_3020,auVar18);
          local_f00 = local_2600._0_8_;
          uStack_ef8 = local_2600._8_8_;
          uStack_ef0 = local_2600._16_8_;
          uStack_ee8 = local_2600._24_8_;
          uStack_ee0 = local_2600._32_8_;
          uStack_ed8 = local_2600._40_8_;
          uStack_ed0 = local_2600._48_8_;
          uStack_ec8 = local_2600._56_8_;
          local_3f40 = auVar19._0_8_;
          local_f40 = local_3f40;
          uStack_3f38 = auVar19._8_8_;
          uStack_f38 = uStack_3f38;
          uStack_3f30 = auVar19._16_8_;
          uStack_f30 = uStack_3f30;
          uStack_3f28 = auVar19._24_8_;
          uStack_f28 = uStack_3f28;
          uStack_3f20 = auVar19._32_8_;
          uStack_f20 = uStack_3f20;
          uStack_3f18 = auVar19._40_8_;
          uStack_f18 = uStack_3f18;
          uStack_3f10 = auVar19._48_8_;
          uStack_f10 = uStack_3f10;
          uStack_3f08 = auVar19._56_8_;
          uStack_f08 = uStack_3f08;
          auVar19 = vfmadd213ps_avx512f(local_2600,*local_3040,auVar19);
          local_2b88 = (undefined8 *)(*pauVar14 + (long)(local_3a54 << 4) * 4);
          local_3ec0 = auVar21._0_8_;
          local_2c00 = local_3ec0;
          uStack_3eb8 = auVar21._8_8_;
          uStack_2bf8 = uStack_3eb8;
          uStack_3eb0 = auVar21._16_8_;
          uStack_2bf0 = uStack_3eb0;
          uStack_3ea8 = auVar21._24_8_;
          uStack_2be8 = uStack_3ea8;
          uStack_3ea0 = auVar21._32_8_;
          uStack_2be0 = uStack_3ea0;
          uStack_3e98 = auVar21._40_8_;
          uStack_2bd8 = uStack_3e98;
          uStack_3e90 = auVar21._48_8_;
          uStack_2bd0 = uStack_3e90;
          uStack_3e88 = auVar21._56_8_;
          uStack_2bc8 = uStack_3e88;
          *local_2b88 = local_3ec0;
          local_2b88[1] = uStack_3eb8;
          local_2b88[2] = uStack_3eb0;
          local_2b88[3] = uStack_3ea8;
          local_2b88[4] = uStack_3ea0;
          local_2b88[5] = uStack_3e98;
          local_2b88[6] = uStack_3e90;
          local_2b88[7] = uStack_3e88;
          local_2c08 = (undefined8 *)(*pauVar13 + (long)(local_3a54 << 4) * 4);
          local_3f00 = auVar18._0_8_;
          local_2c80 = local_3f00;
          uStack_3ef8 = auVar18._8_8_;
          uStack_2c78 = uStack_3ef8;
          uStack_3ef0 = auVar18._16_8_;
          uStack_2c70 = uStack_3ef0;
          uStack_3ee8 = auVar18._24_8_;
          uStack_2c68 = uStack_3ee8;
          uStack_3ee0 = auVar18._32_8_;
          uStack_2c60 = uStack_3ee0;
          uStack_3ed8 = auVar18._40_8_;
          uStack_2c58 = uStack_3ed8;
          uStack_3ed0 = auVar18._48_8_;
          uStack_2c50 = uStack_3ed0;
          uStack_3ec8 = auVar18._56_8_;
          uStack_2c48 = uStack_3ec8;
          *local_2c08 = local_3f00;
          local_2c08[1] = uStack_3ef8;
          local_2c08[2] = uStack_3ef0;
          local_2c08[3] = uStack_3ee8;
          local_2c08[4] = uStack_3ee0;
          local_2c08[5] = uStack_3ed8;
          local_2c08[6] = uStack_3ed0;
          local_2c08[7] = uStack_3ec8;
          local_2c88 = (undefined8 *)(*pauVar12 + (long)(local_3a54 << 4) * 4);
          local_3f40 = auVar19._0_8_;
          local_2d00 = local_3f40;
          uStack_3f38 = auVar19._8_8_;
          uStack_2cf8 = uStack_3f38;
          uStack_3f30 = auVar19._16_8_;
          uStack_2cf0 = uStack_3f30;
          uStack_3f28 = auVar19._24_8_;
          uStack_2ce8 = uStack_3f28;
          uStack_3f20 = auVar19._32_8_;
          uStack_2ce0 = uStack_3f20;
          uStack_3f18 = auVar19._40_8_;
          uStack_2cd8 = uStack_3f18;
          uStack_3f10 = auVar19._48_8_;
          uStack_2cd0 = uStack_3f10;
          uStack_3f08 = auVar19._56_8_;
          uStack_2cc8 = uStack_3f08;
          *local_2c88 = local_3f40;
          local_2c88[1] = uStack_3f38;
          local_2c88[2] = uStack_3f30;
          local_2c88[3] = uStack_3f28;
          local_2c88[4] = uStack_3f20;
          local_2c88[5] = uStack_3f18;
          local_2c88[6] = uStack_3f10;
          local_2c88[7] = uStack_3f08;
          local_3a38 = local_3a38 + 4;
        }
      }
      else {
        local_315c = iVar1 + -1;
        local_3158 = local_31d0;
        lVar4 = *local_31d0;
        iVar2 = *(int *)((long)local_31d0 + 0x2c);
        lVar5 = local_31d0[2];
        local_3168 = local_31d0;
        lVar6 = *local_31d0;
        iVar3 = *(int *)((long)local_31d0 + 0x2c);
        lVar7 = local_31d0[2];
        local_317c = iVar1 + 1;
        local_3178 = local_31d0;
        lVar8 = *local_31d0;
        iVar15 = *(int *)((long)local_31d0 + 0x2c);
        lVar9 = local_31d0[2];
        local_318c = iVar1 + 2;
        local_3188 = local_31d0;
        lVar10 = *local_31d0;
        iVar16 = *(int *)((long)local_31d0 + 0x2c);
        lVar11 = local_31d0[2];
        local_3f68 = local_31e0;
        for (local_3f8c = 0; local_316c = iVar1, local_3f8c < local_31fc;
            local_3f8c = local_3f8c + 1) {
          iVar17 = *(int *)(local_31e8 + (long)local_3f8c * 4) << 4;
          local_3050 = (undefined1 (*) [64])
                       (lVar4 + (long)iVar2 * (long)local_315c * lVar5 + (long)iVar17 * 4);
          local_3070 = (undefined1 (*) [64])
                       (lVar6 + (long)iVar3 * (long)iVar1 * lVar7 + (long)iVar17 * 4);
          local_3090 = (undefined1 (*) [64])
                       (lVar8 + (long)iVar15 * (long)local_317c * lVar9 + (long)iVar17 * 4);
          local_30b0 = (undefined1 (*) [64])
                       (lVar10 + (long)iVar16 * (long)local_318c * lVar11 + (long)iVar17 * 4);
          local_2604 = *local_3f68;
          local_2680 = vbroadcastss_avx512f(ZEXT416(local_2604));
          local_2684 = local_3f68[1];
          local_2700 = vbroadcastss_avx512f(ZEXT416(local_2684));
          local_2704 = local_3f68[2];
          local_2780 = vbroadcastss_avx512f(ZEXT416(local_2704));
          local_2784 = local_3f68[3];
          local_2800 = vbroadcastss_avx512f(ZEXT416(local_2784));
          local_3048 = local_3050 + -1;
          local_1dc0 = *(undefined8 *)*local_3048;
          uStack_1db8 = *(undefined8 *)(local_3050[-1] + 8);
          uStack_1db0 = *(undefined8 *)(local_3050[-1] + 0x10);
          uStack_1da8 = *(undefined8 *)(local_3050[-1] + 0x18);
          uStack_1da0 = *(undefined8 *)(local_3050[-1] + 0x20);
          uStack_1d98 = *(undefined8 *)(local_3050[-1] + 0x28);
          uStack_1d90 = *(undefined8 *)(local_3050[-1] + 0x30);
          uStack_1d88 = *(undefined8 *)(local_3050[-1] + 0x38);
          local_f80 = *(undefined8 *)*local_3050;
          uStack_f78 = *(undefined8 *)(*local_3050 + 8);
          uStack_f70 = *(undefined8 *)(*local_3050 + 0x10);
          uStack_f68 = *(undefined8 *)(*local_3050 + 0x18);
          uStack_f60 = *(undefined8 *)(*local_3050 + 0x20);
          uStack_f58 = *(undefined8 *)(*local_3050 + 0x28);
          uStack_f50 = *(undefined8 *)(*local_3050 + 0x30);
          uStack_f48 = *(undefined8 *)(*local_3050 + 0x38);
          local_3058 = local_3050 + 1;
          local_1280 = *(undefined8 *)*local_3058;
          uStack_1278 = *(undefined8 *)(local_3050[1] + 8);
          uStack_1270 = *(undefined8 *)(local_3050[1] + 0x10);
          uStack_1268 = *(undefined8 *)(local_3050[1] + 0x18);
          uStack_1260 = *(undefined8 *)(local_3050[1] + 0x20);
          uStack_1258 = *(undefined8 *)(local_3050[1] + 0x28);
          uStack_1250 = *(undefined8 *)(local_3050[1] + 0x30);
          uStack_1248 = *(undefined8 *)(local_3050[1] + 0x38);
          local_3060 = local_3050 + 2;
          local_1580 = *(undefined8 *)*local_3060;
          uStack_1578 = *(undefined8 *)(local_3050[2] + 8);
          uStack_1570 = *(undefined8 *)(local_3050[2] + 0x10);
          uStack_1568 = *(undefined8 *)(local_3050[2] + 0x18);
          uStack_1560 = *(undefined8 *)(local_3050[2] + 0x20);
          uStack_1558 = *(undefined8 *)(local_3050[2] + 0x28);
          uStack_1550 = *(undefined8 *)(local_3050[2] + 0x30);
          uStack_1548 = *(undefined8 *)(local_3050[2] + 0x38);
          local_3068 = local_3070 + -1;
          local_1e40 = *(undefined8 *)*local_3068;
          uStack_1e38 = *(undefined8 *)(local_3070[-1] + 8);
          uStack_1e30 = *(undefined8 *)(local_3070[-1] + 0x10);
          uStack_1e28 = *(undefined8 *)(local_3070[-1] + 0x18);
          uStack_1e20 = *(undefined8 *)(local_3070[-1] + 0x20);
          uStack_1e18 = *(undefined8 *)(local_3070[-1] + 0x28);
          uStack_1e10 = *(undefined8 *)(local_3070[-1] + 0x30);
          uStack_1e08 = *(undefined8 *)(local_3070[-1] + 0x38);
          local_1040 = *(undefined8 *)*local_3070;
          uStack_1038 = *(undefined8 *)(*local_3070 + 8);
          uStack_1030 = *(undefined8 *)(*local_3070 + 0x10);
          uStack_1028 = *(undefined8 *)(*local_3070 + 0x18);
          uStack_1020 = *(undefined8 *)(*local_3070 + 0x20);
          uStack_1018 = *(undefined8 *)(*local_3070 + 0x28);
          uStack_1010 = *(undefined8 *)(*local_3070 + 0x30);
          uStack_1008 = *(undefined8 *)(*local_3070 + 0x38);
          local_3078 = local_3070 + 1;
          local_1340 = *(undefined8 *)*local_3078;
          uStack_1338 = *(undefined8 *)(local_3070[1] + 8);
          uStack_1330 = *(undefined8 *)(local_3070[1] + 0x10);
          uStack_1328 = *(undefined8 *)(local_3070[1] + 0x18);
          uStack_1320 = *(undefined8 *)(local_3070[1] + 0x20);
          uStack_1318 = *(undefined8 *)(local_3070[1] + 0x28);
          uStack_1310 = *(undefined8 *)(local_3070[1] + 0x30);
          uStack_1308 = *(undefined8 *)(local_3070[1] + 0x38);
          local_3080 = local_3070 + 2;
          local_1640 = *(undefined8 *)*local_3080;
          uStack_1638 = *(undefined8 *)(local_3070[2] + 8);
          uStack_1630 = *(undefined8 *)(local_3070[2] + 0x10);
          uStack_1628 = *(undefined8 *)(local_3070[2] + 0x18);
          uStack_1620 = *(undefined8 *)(local_3070[2] + 0x20);
          uStack_1618 = *(undefined8 *)(local_3070[2] + 0x28);
          uStack_1610 = *(undefined8 *)(local_3070[2] + 0x30);
          uStack_1608 = *(undefined8 *)(local_3070[2] + 0x38);
          local_3088 = local_3090 + -1;
          local_1ec0 = *(undefined8 *)*local_3088;
          uStack_1eb8 = *(undefined8 *)(local_3090[-1] + 8);
          uStack_1eb0 = *(undefined8 *)(local_3090[-1] + 0x10);
          uStack_1ea8 = *(undefined8 *)(local_3090[-1] + 0x18);
          uStack_1ea0 = *(undefined8 *)(local_3090[-1] + 0x20);
          uStack_1e98 = *(undefined8 *)(local_3090[-1] + 0x28);
          uStack_1e90 = *(undefined8 *)(local_3090[-1] + 0x30);
          uStack_1e88 = *(undefined8 *)(local_3090[-1] + 0x38);
          local_1100 = *(undefined8 *)*local_3090;
          uStack_10f8 = *(undefined8 *)(*local_3090 + 8);
          uStack_10f0 = *(undefined8 *)(*local_3090 + 0x10);
          uStack_10e8 = *(undefined8 *)(*local_3090 + 0x18);
          uStack_10e0 = *(undefined8 *)(*local_3090 + 0x20);
          uStack_10d8 = *(undefined8 *)(*local_3090 + 0x28);
          uStack_10d0 = *(undefined8 *)(*local_3090 + 0x30);
          uStack_10c8 = *(undefined8 *)(*local_3090 + 0x38);
          local_3098 = local_3090 + 1;
          local_1400 = *(undefined8 *)*local_3098;
          uStack_13f8 = *(undefined8 *)(local_3090[1] + 8);
          uStack_13f0 = *(undefined8 *)(local_3090[1] + 0x10);
          uStack_13e8 = *(undefined8 *)(local_3090[1] + 0x18);
          uStack_13e0 = *(undefined8 *)(local_3090[1] + 0x20);
          uStack_13d8 = *(undefined8 *)(local_3090[1] + 0x28);
          uStack_13d0 = *(undefined8 *)(local_3090[1] + 0x30);
          uStack_13c8 = *(undefined8 *)(local_3090[1] + 0x38);
          local_30a0 = local_3090 + 2;
          local_1700 = *(undefined8 *)*local_30a0;
          uStack_16f8 = *(undefined8 *)(local_3090[2] + 8);
          uStack_16f0 = *(undefined8 *)(local_3090[2] + 0x10);
          uStack_16e8 = *(undefined8 *)(local_3090[2] + 0x18);
          uStack_16e0 = *(undefined8 *)(local_3090[2] + 0x20);
          uStack_16d8 = *(undefined8 *)(local_3090[2] + 0x28);
          uStack_16d0 = *(undefined8 *)(local_3090[2] + 0x30);
          uStack_16c8 = *(undefined8 *)(local_3090[2] + 0x38);
          local_30a8 = local_30b0 + -1;
          local_1f40 = *(undefined8 *)*local_30a8;
          uStack_1f38 = *(undefined8 *)(local_30b0[-1] + 8);
          uStack_1f30 = *(undefined8 *)(local_30b0[-1] + 0x10);
          uStack_1f28 = *(undefined8 *)(local_30b0[-1] + 0x18);
          uStack_1f20 = *(undefined8 *)(local_30b0[-1] + 0x20);
          uStack_1f18 = *(undefined8 *)(local_30b0[-1] + 0x28);
          uStack_1f10 = *(undefined8 *)(local_30b0[-1] + 0x30);
          uStack_1f08 = *(undefined8 *)(local_30b0[-1] + 0x38);
          local_11c0 = *(undefined8 *)*local_30b0;
          uStack_11b8 = *(undefined8 *)(*local_30b0 + 8);
          uStack_11b0 = *(undefined8 *)(*local_30b0 + 0x10);
          uStack_11a8 = *(undefined8 *)(*local_30b0 + 0x18);
          uStack_11a0 = *(undefined8 *)(*local_30b0 + 0x20);
          uStack_1198 = *(undefined8 *)(*local_30b0 + 0x28);
          uStack_1190 = *(undefined8 *)(*local_30b0 + 0x30);
          uStack_1188 = *(undefined8 *)(*local_30b0 + 0x38);
          local_30b8 = local_30b0 + 1;
          local_14c0 = *(undefined8 *)*local_30b8;
          uStack_14b8 = *(undefined8 *)(local_30b0[1] + 8);
          uStack_14b0 = *(undefined8 *)(local_30b0[1] + 0x10);
          uStack_14a8 = *(undefined8 *)(local_30b0[1] + 0x18);
          uStack_14a0 = *(undefined8 *)(local_30b0[1] + 0x20);
          uStack_1498 = *(undefined8 *)(local_30b0[1] + 0x28);
          uStack_1490 = *(undefined8 *)(local_30b0[1] + 0x30);
          uStack_1488 = *(undefined8 *)(local_30b0[1] + 0x38);
          local_30c0 = local_30b0 + 2;
          local_17c0 = *(undefined8 *)*local_30c0;
          uStack_17b8 = *(undefined8 *)(local_30b0[2] + 8);
          uStack_17b0 = *(undefined8 *)(local_30b0[2] + 0x10);
          uStack_17a8 = *(undefined8 *)(local_30b0[2] + 0x18);
          uStack_17a0 = *(undefined8 *)(local_30b0[2] + 0x20);
          uStack_1798 = *(undefined8 *)(local_30b0[2] + 0x28);
          uStack_1790 = *(undefined8 *)(local_30b0[2] + 0x30);
          uStack_1788 = *(undefined8 *)(local_30b0[2] + 0x38);
          local_1e00 = local_2680._0_8_;
          uStack_1df8 = local_2680._8_8_;
          uStack_1df0 = local_2680._16_8_;
          uStack_1de8 = local_2680._24_8_;
          uStack_1de0 = local_2680._32_8_;
          uStack_1dd8 = local_2680._40_8_;
          uStack_1dd0 = local_2680._48_8_;
          uStack_1dc8 = local_2680._56_8_;
          auVar21 = vmulps_avx512f(*local_3048,local_2680);
          local_1e80 = local_2680._0_8_;
          uStack_1e78 = local_2680._8_8_;
          uStack_1e70 = local_2680._16_8_;
          uStack_1e68 = local_2680._24_8_;
          uStack_1e60 = local_2680._32_8_;
          uStack_1e58 = local_2680._40_8_;
          uStack_1e50 = local_2680._48_8_;
          uStack_1e48 = local_2680._56_8_;
          auVar18 = vmulps_avx512f(*local_3068,local_2680);
          local_1f00 = local_2680._0_8_;
          uStack_1ef8 = local_2680._8_8_;
          uStack_1ef0 = local_2680._16_8_;
          uStack_1ee8 = local_2680._24_8_;
          uStack_1ee0 = local_2680._32_8_;
          uStack_1ed8 = local_2680._40_8_;
          uStack_1ed0 = local_2680._48_8_;
          uStack_1ec8 = local_2680._56_8_;
          auVar19 = vmulps_avx512f(*local_3088,local_2680);
          local_1f80 = local_2680._0_8_;
          uStack_1f78 = local_2680._8_8_;
          uStack_1f70 = local_2680._16_8_;
          uStack_1f68 = local_2680._24_8_;
          uStack_1f60 = local_2680._32_8_;
          uStack_1f58 = local_2680._40_8_;
          uStack_1f50 = local_2680._48_8_;
          uStack_1f48 = local_2680._56_8_;
          auVar20 = vmulps_avx512f(*local_30a8,local_2680);
          local_fc0 = local_2700._0_8_;
          uStack_fb8 = local_2700._8_8_;
          uStack_fb0 = local_2700._16_8_;
          uStack_fa8 = local_2700._24_8_;
          uStack_fa0 = local_2700._32_8_;
          uStack_f98 = local_2700._40_8_;
          uStack_f90 = local_2700._48_8_;
          uStack_f88 = local_2700._56_8_;
          local_4500 = auVar21._0_8_;
          local_1000 = local_4500;
          uStack_44f8 = auVar21._8_8_;
          uStack_ff8 = uStack_44f8;
          uStack_44f0 = auVar21._16_8_;
          uStack_ff0 = uStack_44f0;
          uStack_44e8 = auVar21._24_8_;
          uStack_fe8 = uStack_44e8;
          uStack_44e0 = auVar21._32_8_;
          uStack_fe0 = uStack_44e0;
          uStack_44d8 = auVar21._40_8_;
          uStack_fd8 = uStack_44d8;
          uStack_44d0 = auVar21._48_8_;
          uStack_fd0 = uStack_44d0;
          uStack_44c8 = auVar21._56_8_;
          uStack_fc8 = uStack_44c8;
          auVar21 = vfmadd213ps_avx512f(local_2700,*local_3050,auVar21);
          local_1080 = local_2700._0_8_;
          uStack_1078 = local_2700._8_8_;
          uStack_1070 = local_2700._16_8_;
          uStack_1068 = local_2700._24_8_;
          uStack_1060 = local_2700._32_8_;
          uStack_1058 = local_2700._40_8_;
          uStack_1050 = local_2700._48_8_;
          uStack_1048 = local_2700._56_8_;
          local_4540 = auVar18._0_8_;
          local_10c0 = local_4540;
          uStack_4538 = auVar18._8_8_;
          uStack_10b8 = uStack_4538;
          uStack_4530 = auVar18._16_8_;
          uStack_10b0 = uStack_4530;
          uStack_4528 = auVar18._24_8_;
          uStack_10a8 = uStack_4528;
          uStack_4520 = auVar18._32_8_;
          uStack_10a0 = uStack_4520;
          uStack_4518 = auVar18._40_8_;
          uStack_1098 = uStack_4518;
          uStack_4510 = auVar18._48_8_;
          uStack_1090 = uStack_4510;
          uStack_4508 = auVar18._56_8_;
          uStack_1088 = uStack_4508;
          auVar18 = vfmadd213ps_avx512f(local_2700,*local_3070,auVar18);
          local_1140 = local_2700._0_8_;
          uStack_1138 = local_2700._8_8_;
          uStack_1130 = local_2700._16_8_;
          uStack_1128 = local_2700._24_8_;
          uStack_1120 = local_2700._32_8_;
          uStack_1118 = local_2700._40_8_;
          uStack_1110 = local_2700._48_8_;
          uStack_1108 = local_2700._56_8_;
          local_4580 = auVar19._0_8_;
          local_1180 = local_4580;
          uStack_4578 = auVar19._8_8_;
          uStack_1178 = uStack_4578;
          uStack_4570 = auVar19._16_8_;
          uStack_1170 = uStack_4570;
          uStack_4568 = auVar19._24_8_;
          uStack_1168 = uStack_4568;
          uStack_4560 = auVar19._32_8_;
          uStack_1160 = uStack_4560;
          uStack_4558 = auVar19._40_8_;
          uStack_1158 = uStack_4558;
          uStack_4550 = auVar19._48_8_;
          uStack_1150 = uStack_4550;
          uStack_4548 = auVar19._56_8_;
          uStack_1148 = uStack_4548;
          auVar19 = vfmadd213ps_avx512f(local_2700,*local_3090,auVar19);
          local_1200 = local_2700._0_8_;
          uStack_11f8 = local_2700._8_8_;
          uStack_11f0 = local_2700._16_8_;
          uStack_11e8 = local_2700._24_8_;
          uStack_11e0 = local_2700._32_8_;
          uStack_11d8 = local_2700._40_8_;
          uStack_11d0 = local_2700._48_8_;
          uStack_11c8 = local_2700._56_8_;
          local_45c0 = auVar20._0_8_;
          local_1240 = local_45c0;
          uStack_45b8 = auVar20._8_8_;
          uStack_1238 = uStack_45b8;
          uStack_45b0 = auVar20._16_8_;
          uStack_1230 = uStack_45b0;
          uStack_45a8 = auVar20._24_8_;
          uStack_1228 = uStack_45a8;
          uStack_45a0 = auVar20._32_8_;
          uStack_1220 = uStack_45a0;
          uStack_4598 = auVar20._40_8_;
          uStack_1218 = uStack_4598;
          uStack_4590 = auVar20._48_8_;
          uStack_1210 = uStack_4590;
          uStack_4588 = auVar20._56_8_;
          uStack_1208 = uStack_4588;
          auVar20 = vfmadd213ps_avx512f(local_2700,*local_30b0,auVar20);
          local_12c0 = local_2780._0_8_;
          uStack_12b8 = local_2780._8_8_;
          uStack_12b0 = local_2780._16_8_;
          uStack_12a8 = local_2780._24_8_;
          uStack_12a0 = local_2780._32_8_;
          uStack_1298 = local_2780._40_8_;
          uStack_1290 = local_2780._48_8_;
          uStack_1288 = local_2780._56_8_;
          local_4500 = auVar21._0_8_;
          local_1300 = local_4500;
          uStack_44f8 = auVar21._8_8_;
          uStack_12f8 = uStack_44f8;
          uStack_44f0 = auVar21._16_8_;
          uStack_12f0 = uStack_44f0;
          uStack_44e8 = auVar21._24_8_;
          uStack_12e8 = uStack_44e8;
          uStack_44e0 = auVar21._32_8_;
          uStack_12e0 = uStack_44e0;
          uStack_44d8 = auVar21._40_8_;
          uStack_12d8 = uStack_44d8;
          uStack_44d0 = auVar21._48_8_;
          uStack_12d0 = uStack_44d0;
          uStack_44c8 = auVar21._56_8_;
          uStack_12c8 = uStack_44c8;
          auVar21 = vfmadd213ps_avx512f(local_2780,*local_3058,auVar21);
          local_1380 = local_2780._0_8_;
          uStack_1378 = local_2780._8_8_;
          uStack_1370 = local_2780._16_8_;
          uStack_1368 = local_2780._24_8_;
          uStack_1360 = local_2780._32_8_;
          uStack_1358 = local_2780._40_8_;
          uStack_1350 = local_2780._48_8_;
          uStack_1348 = local_2780._56_8_;
          local_4540 = auVar18._0_8_;
          local_13c0 = local_4540;
          uStack_4538 = auVar18._8_8_;
          uStack_13b8 = uStack_4538;
          uStack_4530 = auVar18._16_8_;
          uStack_13b0 = uStack_4530;
          uStack_4528 = auVar18._24_8_;
          uStack_13a8 = uStack_4528;
          uStack_4520 = auVar18._32_8_;
          uStack_13a0 = uStack_4520;
          uStack_4518 = auVar18._40_8_;
          uStack_1398 = uStack_4518;
          uStack_4510 = auVar18._48_8_;
          uStack_1390 = uStack_4510;
          uStack_4508 = auVar18._56_8_;
          uStack_1388 = uStack_4508;
          auVar18 = vfmadd213ps_avx512f(local_2780,*local_3078,auVar18);
          local_1440 = local_2780._0_8_;
          uStack_1438 = local_2780._8_8_;
          uStack_1430 = local_2780._16_8_;
          uStack_1428 = local_2780._24_8_;
          uStack_1420 = local_2780._32_8_;
          uStack_1418 = local_2780._40_8_;
          uStack_1410 = local_2780._48_8_;
          uStack_1408 = local_2780._56_8_;
          local_4580 = auVar19._0_8_;
          local_1480 = local_4580;
          uStack_4578 = auVar19._8_8_;
          uStack_1478 = uStack_4578;
          uStack_4570 = auVar19._16_8_;
          uStack_1470 = uStack_4570;
          uStack_4568 = auVar19._24_8_;
          uStack_1468 = uStack_4568;
          uStack_4560 = auVar19._32_8_;
          uStack_1460 = uStack_4560;
          uStack_4558 = auVar19._40_8_;
          uStack_1458 = uStack_4558;
          uStack_4550 = auVar19._48_8_;
          uStack_1450 = uStack_4550;
          uStack_4548 = auVar19._56_8_;
          uStack_1448 = uStack_4548;
          auVar19 = vfmadd213ps_avx512f(local_2780,*local_3098,auVar19);
          local_1500 = local_2780._0_8_;
          uStack_14f8 = local_2780._8_8_;
          uStack_14f0 = local_2780._16_8_;
          uStack_14e8 = local_2780._24_8_;
          uStack_14e0 = local_2780._32_8_;
          uStack_14d8 = local_2780._40_8_;
          uStack_14d0 = local_2780._48_8_;
          uStack_14c8 = local_2780._56_8_;
          local_45c0 = auVar20._0_8_;
          local_1540 = local_45c0;
          uStack_45b8 = auVar20._8_8_;
          uStack_1538 = uStack_45b8;
          uStack_45b0 = auVar20._16_8_;
          uStack_1530 = uStack_45b0;
          uStack_45a8 = auVar20._24_8_;
          uStack_1528 = uStack_45a8;
          uStack_45a0 = auVar20._32_8_;
          uStack_1520 = uStack_45a0;
          uStack_4598 = auVar20._40_8_;
          uStack_1518 = uStack_4598;
          uStack_4590 = auVar20._48_8_;
          uStack_1510 = uStack_4590;
          uStack_4588 = auVar20._56_8_;
          uStack_1508 = uStack_4588;
          auVar20 = vfmadd213ps_avx512f(local_2780,*local_30b8,auVar20);
          local_15c0 = local_2800._0_8_;
          uStack_15b8 = local_2800._8_8_;
          uStack_15b0 = local_2800._16_8_;
          uStack_15a8 = local_2800._24_8_;
          uStack_15a0 = local_2800._32_8_;
          uStack_1598 = local_2800._40_8_;
          uStack_1590 = local_2800._48_8_;
          uStack_1588 = local_2800._56_8_;
          local_4500 = auVar21._0_8_;
          local_1600 = local_4500;
          uStack_44f8 = auVar21._8_8_;
          uStack_15f8 = uStack_44f8;
          uStack_44f0 = auVar21._16_8_;
          uStack_15f0 = uStack_44f0;
          uStack_44e8 = auVar21._24_8_;
          uStack_15e8 = uStack_44e8;
          uStack_44e0 = auVar21._32_8_;
          uStack_15e0 = uStack_44e0;
          uStack_44d8 = auVar21._40_8_;
          uStack_15d8 = uStack_44d8;
          uStack_44d0 = auVar21._48_8_;
          uStack_15d0 = uStack_44d0;
          uStack_44c8 = auVar21._56_8_;
          uStack_15c8 = uStack_44c8;
          auVar21 = vfmadd213ps_avx512f(local_2800,*local_3060,auVar21);
          local_1680 = local_2800._0_8_;
          uStack_1678 = local_2800._8_8_;
          uStack_1670 = local_2800._16_8_;
          uStack_1668 = local_2800._24_8_;
          uStack_1660 = local_2800._32_8_;
          uStack_1658 = local_2800._40_8_;
          uStack_1650 = local_2800._48_8_;
          uStack_1648 = local_2800._56_8_;
          local_4540 = auVar18._0_8_;
          local_16c0 = local_4540;
          uStack_4538 = auVar18._8_8_;
          uStack_16b8 = uStack_4538;
          uStack_4530 = auVar18._16_8_;
          uStack_16b0 = uStack_4530;
          uStack_4528 = auVar18._24_8_;
          uStack_16a8 = uStack_4528;
          uStack_4520 = auVar18._32_8_;
          uStack_16a0 = uStack_4520;
          uStack_4518 = auVar18._40_8_;
          uStack_1698 = uStack_4518;
          uStack_4510 = auVar18._48_8_;
          uStack_1690 = uStack_4510;
          uStack_4508 = auVar18._56_8_;
          uStack_1688 = uStack_4508;
          auVar18 = vfmadd213ps_avx512f(local_2800,*local_3080,auVar18);
          local_1740 = local_2800._0_8_;
          uStack_1738 = local_2800._8_8_;
          uStack_1730 = local_2800._16_8_;
          uStack_1728 = local_2800._24_8_;
          uStack_1720 = local_2800._32_8_;
          uStack_1718 = local_2800._40_8_;
          uStack_1710 = local_2800._48_8_;
          uStack_1708 = local_2800._56_8_;
          local_4580 = auVar19._0_8_;
          local_1780 = local_4580;
          uStack_4578 = auVar19._8_8_;
          uStack_1778 = uStack_4578;
          uStack_4570 = auVar19._16_8_;
          uStack_1770 = uStack_4570;
          uStack_4568 = auVar19._24_8_;
          uStack_1768 = uStack_4568;
          uStack_4560 = auVar19._32_8_;
          uStack_1760 = uStack_4560;
          uStack_4558 = auVar19._40_8_;
          uStack_1758 = uStack_4558;
          uStack_4550 = auVar19._48_8_;
          uStack_1750 = uStack_4550;
          uStack_4548 = auVar19._56_8_;
          uStack_1748 = uStack_4548;
          auVar19 = vfmadd213ps_avx512f(local_2800,*local_30a0,auVar19);
          local_1800 = local_2800._0_8_;
          uStack_17f8 = local_2800._8_8_;
          uStack_17f0 = local_2800._16_8_;
          uStack_17e8 = local_2800._24_8_;
          uStack_17e0 = local_2800._32_8_;
          uStack_17d8 = local_2800._40_8_;
          uStack_17d0 = local_2800._48_8_;
          uStack_17c8 = local_2800._56_8_;
          local_45c0 = auVar20._0_8_;
          local_1840 = local_45c0;
          uStack_45b8 = auVar20._8_8_;
          uStack_1838 = uStack_45b8;
          uStack_45b0 = auVar20._16_8_;
          uStack_1830 = uStack_45b0;
          uStack_45a8 = auVar20._24_8_;
          uStack_1828 = uStack_45a8;
          uStack_45a0 = auVar20._32_8_;
          uStack_1820 = uStack_45a0;
          uStack_4598 = auVar20._40_8_;
          uStack_1818 = uStack_4598;
          uStack_4590 = auVar20._48_8_;
          uStack_1810 = uStack_4590;
          uStack_4588 = auVar20._56_8_;
          uStack_1808 = uStack_4588;
          auVar20 = vfmadd213ps_avx512f(local_2800,*local_30c0,auVar20);
          local_2d08 = (undefined8 *)(*local_3338 + (long)(local_3f8c << 4) * 4);
          local_4500 = auVar21._0_8_;
          local_2d80 = local_4500;
          uStack_44f8 = auVar21._8_8_;
          uStack_2d78 = uStack_44f8;
          uStack_44f0 = auVar21._16_8_;
          uStack_2d70 = uStack_44f0;
          uStack_44e8 = auVar21._24_8_;
          uStack_2d68 = uStack_44e8;
          uStack_44e0 = auVar21._32_8_;
          uStack_2d60 = uStack_44e0;
          uStack_44d8 = auVar21._40_8_;
          uStack_2d58 = uStack_44d8;
          uStack_44d0 = auVar21._48_8_;
          uStack_2d50 = uStack_44d0;
          uStack_44c8 = auVar21._56_8_;
          uStack_2d48 = uStack_44c8;
          *local_2d08 = local_4500;
          local_2d08[1] = uStack_44f8;
          local_2d08[2] = uStack_44f0;
          local_2d08[3] = uStack_44e8;
          local_2d08[4] = uStack_44e0;
          local_2d08[5] = uStack_44d8;
          local_2d08[6] = uStack_44d0;
          local_2d08[7] = uStack_44c8;
          local_2d88 = (undefined8 *)(*local_3340 + (long)(local_3f8c << 4) * 4);
          local_4540 = auVar18._0_8_;
          local_2e00 = local_4540;
          uStack_4538 = auVar18._8_8_;
          uStack_2df8 = uStack_4538;
          uStack_4530 = auVar18._16_8_;
          uStack_2df0 = uStack_4530;
          uStack_4528 = auVar18._24_8_;
          uStack_2de8 = uStack_4528;
          uStack_4520 = auVar18._32_8_;
          uStack_2de0 = uStack_4520;
          uStack_4518 = auVar18._40_8_;
          uStack_2dd8 = uStack_4518;
          uStack_4510 = auVar18._48_8_;
          uStack_2dd0 = uStack_4510;
          uStack_4508 = auVar18._56_8_;
          uStack_2dc8 = uStack_4508;
          *local_2d88 = local_4540;
          local_2d88[1] = uStack_4538;
          local_2d88[2] = uStack_4530;
          local_2d88[3] = uStack_4528;
          local_2d88[4] = uStack_4520;
          local_2d88[5] = uStack_4518;
          local_2d88[6] = uStack_4510;
          local_2d88[7] = uStack_4508;
          local_2e08 = (undefined8 *)(*local_3348 + (long)(local_3f8c << 4) * 4);
          local_4580 = auVar19._0_8_;
          local_2e80 = local_4580;
          uStack_4578 = auVar19._8_8_;
          uStack_2e78 = uStack_4578;
          uStack_4570 = auVar19._16_8_;
          uStack_2e70 = uStack_4570;
          uStack_4568 = auVar19._24_8_;
          uStack_2e68 = uStack_4568;
          uStack_4560 = auVar19._32_8_;
          uStack_2e60 = uStack_4560;
          uStack_4558 = auVar19._40_8_;
          uStack_2e58 = uStack_4558;
          uStack_4550 = auVar19._48_8_;
          uStack_2e50 = uStack_4550;
          uStack_4548 = auVar19._56_8_;
          uStack_2e48 = uStack_4548;
          *local_2e08 = local_4580;
          local_2e08[1] = uStack_4578;
          local_2e08[2] = uStack_4570;
          local_2e08[3] = uStack_4568;
          local_2e08[4] = uStack_4560;
          local_2e08[5] = uStack_4558;
          local_2e08[6] = uStack_4550;
          local_2e08[7] = uStack_4548;
          local_2e88 = (undefined8 *)(*local_3350 + (long)(local_3f8c << 4) * 4);
          local_45c0 = auVar20._0_8_;
          local_2f00 = local_45c0;
          uStack_45b8 = auVar20._8_8_;
          uStack_2ef8 = uStack_45b8;
          uStack_45b0 = auVar20._16_8_;
          uStack_2ef0 = uStack_45b0;
          uStack_45a8 = auVar20._24_8_;
          uStack_2ee8 = uStack_45a8;
          uStack_45a0 = auVar20._32_8_;
          uStack_2ee0 = uStack_45a0;
          uStack_4598 = auVar20._40_8_;
          uStack_2ed8 = uStack_4598;
          uStack_4590 = auVar20._48_8_;
          uStack_2ed0 = uStack_4590;
          uStack_4588 = auVar20._56_8_;
          uStack_2ec8 = uStack_4588;
          *local_2e88 = local_45c0;
          local_2e88[1] = uStack_45b8;
          local_2e88[2] = uStack_45b0;
          local_2e88[3] = uStack_45a8;
          local_2e88[4] = uStack_45a0;
          local_2e88[5] = uStack_4598;
          local_2e88[6] = uStack_4590;
          local_2e88[7] = uStack_4588;
          local_3f68 = local_3f68 + 4;
        }
      }
    }
    local_2804 = *local_31f0;
    local_2880 = vbroadcastss_avx512f(ZEXT416(local_2804));
    local_2884 = local_31f0[1];
    local_2900 = vbroadcastss_avx512f(ZEXT416(local_2884));
    local_2904 = local_31f0[2];
    local_2980 = vbroadcastss_avx512f(ZEXT416(local_2904));
    local_2984 = local_31f0[3];
    local_2a00 = vbroadcastss_avx512f(ZEXT416(local_2984));
    local_46c8 = local_3338;
    local_46d0 = local_3340;
    local_46d8 = local_3348;
    local_46e0 = local_3350;
    local_30e8 = local_31d8;
    local_30ec = local_3358;
    local_46e8 = (undefined8 *)
                 (*local_31d8 +
                 (long)*(int *)((long)local_31d8 + 0x2c) * (long)local_3358 * local_31d8[2]);
    for (local_46ec = 0; local_46ec < local_31fc; local_46ec = local_46ec + 1) {
      local_30c8 = local_46c8;
      local_1fc0 = *(undefined8 *)*local_46c8;
      uStack_1fb8 = *(undefined8 *)(*local_46c8 + 8);
      uStack_1fb0 = *(undefined8 *)(*local_46c8 + 0x10);
      uStack_1fa8 = *(undefined8 *)(*local_46c8 + 0x18);
      uStack_1fa0 = *(undefined8 *)(*local_46c8 + 0x20);
      uStack_1f98 = *(undefined8 *)(*local_46c8 + 0x28);
      uStack_1f90 = *(undefined8 *)(*local_46c8 + 0x30);
      uStack_1f88 = *(undefined8 *)(*local_46c8 + 0x38);
      local_30d0 = local_46d0;
      local_1880 = *(undefined8 *)*local_46d0;
      uStack_1878 = *(undefined8 *)(*local_46d0 + 8);
      uStack_1870 = *(undefined8 *)(*local_46d0 + 0x10);
      uStack_1868 = *(undefined8 *)(*local_46d0 + 0x18);
      uStack_1860 = *(undefined8 *)(*local_46d0 + 0x20);
      uStack_1858 = *(undefined8 *)(*local_46d0 + 0x28);
      uStack_1850 = *(undefined8 *)(*local_46d0 + 0x30);
      uStack_1848 = *(undefined8 *)(*local_46d0 + 0x38);
      local_30d8 = local_46d8;
      local_1940 = *(undefined8 *)*local_46d8;
      uStack_1938 = *(undefined8 *)(*local_46d8 + 8);
      uStack_1930 = *(undefined8 *)(*local_46d8 + 0x10);
      uStack_1928 = *(undefined8 *)(*local_46d8 + 0x18);
      uStack_1920 = *(undefined8 *)(*local_46d8 + 0x20);
      uStack_1918 = *(undefined8 *)(*local_46d8 + 0x28);
      uStack_1910 = *(undefined8 *)(*local_46d8 + 0x30);
      uStack_1908 = *(undefined8 *)(*local_46d8 + 0x38);
      local_30e0 = local_46e0;
      local_1a00 = *(undefined8 *)*local_46e0;
      uStack_19f8 = *(undefined8 *)(*local_46e0 + 8);
      uStack_19f0 = *(undefined8 *)(*local_46e0 + 0x10);
      uStack_19e8 = *(undefined8 *)(*local_46e0 + 0x18);
      uStack_19e0 = *(undefined8 *)(*local_46e0 + 0x20);
      uStack_19d8 = *(undefined8 *)(*local_46e0 + 0x28);
      uStack_19d0 = *(undefined8 *)(*local_46e0 + 0x30);
      uStack_19c8 = *(undefined8 *)(*local_46e0 + 0x38);
      local_2000 = local_2880._0_8_;
      uStack_1ff8 = local_2880._8_8_;
      uStack_1ff0 = local_2880._16_8_;
      uStack_1fe8 = local_2880._24_8_;
      uStack_1fe0 = local_2880._32_8_;
      uStack_1fd8 = local_2880._40_8_;
      uStack_1fd0 = local_2880._48_8_;
      uStack_1fc8 = local_2880._56_8_;
      auVar21 = vmulps_avx512f(*local_46c8,local_2880);
      local_18c0 = local_2900._0_8_;
      uStack_18b8 = local_2900._8_8_;
      uStack_18b0 = local_2900._16_8_;
      uStack_18a8 = local_2900._24_8_;
      uStack_18a0 = local_2900._32_8_;
      uStack_1898 = local_2900._40_8_;
      uStack_1890 = local_2900._48_8_;
      uStack_1888 = local_2900._56_8_;
      local_4840 = auVar21._0_8_;
      local_1900 = local_4840;
      uStack_4838 = auVar21._8_8_;
      uStack_18f8 = uStack_4838;
      uStack_4830 = auVar21._16_8_;
      uStack_18f0 = uStack_4830;
      uStack_4828 = auVar21._24_8_;
      uStack_18e8 = uStack_4828;
      uStack_4820 = auVar21._32_8_;
      uStack_18e0 = uStack_4820;
      uStack_4818 = auVar21._40_8_;
      uStack_18d8 = uStack_4818;
      uStack_4810 = auVar21._48_8_;
      uStack_18d0 = uStack_4810;
      uStack_4808 = auVar21._56_8_;
      uStack_18c8 = uStack_4808;
      auVar21 = vfmadd213ps_avx512f(local_2900,*local_46d0,auVar21);
      local_1980 = local_2980._0_8_;
      uStack_1978 = local_2980._8_8_;
      uStack_1970 = local_2980._16_8_;
      uStack_1968 = local_2980._24_8_;
      uStack_1960 = local_2980._32_8_;
      uStack_1958 = local_2980._40_8_;
      uStack_1950 = local_2980._48_8_;
      uStack_1948 = local_2980._56_8_;
      local_4840 = auVar21._0_8_;
      local_19c0 = local_4840;
      uStack_4838 = auVar21._8_8_;
      uStack_19b8 = uStack_4838;
      uStack_4830 = auVar21._16_8_;
      uStack_19b0 = uStack_4830;
      uStack_4828 = auVar21._24_8_;
      uStack_19a8 = uStack_4828;
      uStack_4820 = auVar21._32_8_;
      uStack_19a0 = uStack_4820;
      uStack_4818 = auVar21._40_8_;
      uStack_1998 = uStack_4818;
      uStack_4810 = auVar21._48_8_;
      uStack_1990 = uStack_4810;
      uStack_4808 = auVar21._56_8_;
      uStack_1988 = uStack_4808;
      auVar21 = vfmadd213ps_avx512f(local_2980,*local_46d8,auVar21);
      local_1a40 = local_2a00._0_8_;
      uStack_1a38 = local_2a00._8_8_;
      uStack_1a30 = local_2a00._16_8_;
      uStack_1a28 = local_2a00._24_8_;
      uStack_1a20 = local_2a00._32_8_;
      uStack_1a18 = local_2a00._40_8_;
      uStack_1a10 = local_2a00._48_8_;
      uStack_1a08 = local_2a00._56_8_;
      local_4840 = auVar21._0_8_;
      local_1a80 = local_4840;
      uStack_4838 = auVar21._8_8_;
      uStack_1a78 = uStack_4838;
      uStack_4830 = auVar21._16_8_;
      uStack_1a70 = uStack_4830;
      uStack_4828 = auVar21._24_8_;
      uStack_1a68 = uStack_4828;
      uStack_4820 = auVar21._32_8_;
      uStack_1a60 = uStack_4820;
      uStack_4818 = auVar21._40_8_;
      uStack_1a58 = uStack_4818;
      uStack_4810 = auVar21._48_8_;
      uStack_1a50 = uStack_4810;
      uStack_4808 = auVar21._56_8_;
      uStack_1a48 = uStack_4808;
      auVar21 = vfmadd213ps_avx512f(local_2a00,*local_46e0,auVar21);
      local_2f08 = local_46e8;
      local_4840 = auVar21._0_8_;
      local_2f80 = local_4840;
      uStack_4838 = auVar21._8_8_;
      uStack_2f78 = uStack_4838;
      uStack_4830 = auVar21._16_8_;
      uStack_2f70 = uStack_4830;
      uStack_4828 = auVar21._24_8_;
      uStack_2f68 = uStack_4828;
      uStack_4820 = auVar21._32_8_;
      uStack_2f60 = uStack_4820;
      uStack_4818 = auVar21._40_8_;
      uStack_2f58 = uStack_4818;
      uStack_4810 = auVar21._48_8_;
      uStack_2f50 = uStack_4810;
      uStack_4808 = auVar21._56_8_;
      uStack_2f48 = uStack_4808;
      *local_46e8 = local_4840;
      local_46e8[1] = uStack_4838;
      local_46e8[2] = uStack_4830;
      local_46e8[3] = uStack_4828;
      local_46e8[4] = uStack_4820;
      local_46e8[5] = uStack_4818;
      local_46e8[6] = uStack_4810;
      local_46e8[7] = uStack_4808;
      local_46e8 = local_46e8 + 8;
      local_46c8 = local_46c8 + 1;
      local_46d0 = local_46d0 + 1;
      local_46d8 = local_46d8 + 1;
      local_46e0 = local_46e0 + 1;
    }
    local_31f0 = local_31f0 + 4;
    local_3354 = iVar1;
  }
  local_31c8 = &local_3330;
  local_150 = local_31c8;
  if (local_3328 != (int *)0x0) {
    local_154 = 0xffffffff;
    LOCK();
    local_158 = *local_3328;
    *local_3328 = *local_3328 + -1;
    UNLOCK();
    if (local_158 == 1) {
      if (local_3310 == (long *)0x0) {
        local_148 = local_3330;
        if (local_3330 != (undefined1 (*) [64])0x0) {
          free(local_3330);
        }
      }
      else {
        (**(code **)(*local_3310 + 0x18))(local_3310,local_3330);
      }
    }
  }
  local_3330 = (undefined1 (*) [64])0x0;
  local_3320 = 0;
  local_3318 = 0;
  local_3308 = 0;
  local_3304 = 0;
  local_3300 = 0;
  local_32fc = 0;
  local_32f8 = 0;
  local_32f0 = 0;
  local_3328 = (int *)0x0;
  local_31c0 = &local_32e8;
  local_160 = local_31c0;
  if (local_32e0 != (int *)0x0) {
    local_164 = 0xffffffff;
    LOCK();
    local_168 = *local_32e0;
    *local_32e0 = *local_32e0 + -1;
    UNLOCK();
    if (local_168 == 1) {
      if (local_32c8 == (long *)0x0) {
        local_140 = local_32e8;
        if (local_32e8 != (undefined1 (*) [64])0x0) {
          free(local_32e8);
        }
      }
      else {
        (**(code **)(*local_32c8 + 0x18))(local_32c8,local_32e8);
      }
    }
  }
  local_32e8 = (undefined1 (*) [64])0x0;
  local_32d8 = 0;
  local_32d0 = 0;
  local_32c0 = 0;
  local_32bc = 0;
  local_32b8 = 0;
  local_32b4 = 0;
  local_32b0 = 0;
  local_32a8 = 0;
  local_32e0 = (int *)0x0;
  local_31b0 = &local_3290;
  local_180 = local_31b0;
  if (local_3288 != (int *)0x0) {
    local_184 = 0xffffffff;
    LOCK();
    local_188 = *local_3288;
    *local_3288 = *local_3288 + -1;
    UNLOCK();
    if (local_188 == 1) {
      if (local_3270 == (long *)0x0) {
        local_130 = local_3290;
        if (local_3290 != (undefined1 (*) [64])0x0) {
          free(local_3290);
        }
      }
      else {
        (**(code **)(*local_3270 + 0x18))(local_3270,local_3290);
      }
    }
  }
  local_3290 = (undefined1 (*) [64])0x0;
  local_3280 = 0;
  local_3278 = 0;
  local_3268 = 0;
  local_3264 = 0;
  local_3260 = 0;
  local_325c = 0;
  local_3258 = 0;
  local_3250 = 0;
  local_3288 = (int *)0x0;
  ppauVar22 = &local_3248;
  if (local_3240 != (int *)0x0) {
    local_1a4 = 0xffffffff;
    LOCK();
    local_1a8 = *local_3240;
    *local_3240 = *local_3240 + -1;
    UNLOCK();
    if (local_1a8 == 1) {
      local_31a0 = ppauVar22;
      local_1a0 = ppauVar22;
      if (local_3228 == (long *)0x0) {
        local_120 = local_3248;
        if (local_3248 != (undefined1 (*) [64])0x0) {
          free(local_3248);
        }
      }
      else {
        (**(code **)(*local_3228 + 0x18))(local_3228,local_3248);
      }
    }
  }
  *ppauVar22 = (undefined1 (*) [64])0x0;
  ppauVar22[2] = (undefined1 (*) [64])0x0;
  *(undefined4 *)(ppauVar22 + 3) = 0;
  *(undefined4 *)(ppauVar22 + 5) = 0;
  *(undefined4 *)((long)ppauVar22 + 0x2c) = 0;
  *(undefined4 *)(ppauVar22 + 6) = 0;
  *(undefined4 *)((long)ppauVar22 + 0x34) = 0;
  *(undefined4 *)(ppauVar22 + 7) = 0;
  ppauVar22[8] = (undefined1 (*) [64])0x0;
  ppauVar22[1] = (undefined1 (*) [64])0x0;
  return;
}

Assistant:

static void resize_bicubic_image_pack16(const Mat& src, Mat& dst, float* alpha, int* xofs, float* beta, int* yofs)
{
    int w = dst.w;
    int h = dst.h;

    // loop body
    Mat rowsbuf0(w, (size_t)16 * 4u, 16);
    Mat rowsbuf1(w, (size_t)16 * 4u, 16);
    Mat rowsbuf2(w, (size_t)16 * 4u, 16);
    Mat rowsbuf3(w, (size_t)16 * 4u, 16);
    float* rows0 = rowsbuf0;
    float* rows1 = rowsbuf1;
    float* rows2 = rowsbuf2;
    float* rows3 = rowsbuf3;

    int prev_sy1 = -3;

    for (int dy = 0; dy < h; dy++)
    {
        int sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 1)
        {
            // hresize one row
            float* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows2;
            rows2 = rows3;
            rows3 = rows0_old;
            const float* S3 = src.row(sy + 2);

            const float* alphap = alpha;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx] * 16;
                const float* S3p = S3 + sx;

                __m512 _a0 = _mm512_set1_ps(alphap[0]);
                __m512 _a1 = _mm512_set1_ps(alphap[1]);
                __m512 _a2 = _mm512_set1_ps(alphap[2]);
                __m512 _a3 = _mm512_set1_ps(alphap[3]);

                __m512 _S30 = _mm512_load_ps(S3p - 16);
                __m512 _S31 = _mm512_load_ps(S3p + 0);
                __m512 _S32 = _mm512_load_ps(S3p + 16);
                __m512 _S33 = _mm512_load_ps(S3p + 32);
                __m512 _rows3 = _mm512_mul_ps(_S30, _a0);
                _rows3 = _mm512_fmadd_ps(_S31, _a1, _rows3);
                _rows3 = _mm512_fmadd_ps(_S32, _a2, _rows3);
                _rows3 = _mm512_fmadd_ps(_S33, _a3, _rows3);
                _mm512_store_ps(rows3p + dx * 16, _rows3);

                alphap += 4;
            }
        }
        else if (sy == prev_sy1 + 2)
        {
            // hresize two rows
            float* rows0_old = rows0;
            float* rows1_old = rows1;
            rows0 = rows2;
            rows1 = rows3;
            rows2 = rows0_old;
            rows3 = rows1_old;
            const float* S2 = src.row(sy + 1);
            const float* S3 = src.row(sy + 2);

            const float* alphap = alpha;
            float* rows2p = rows2;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx] * 16;
                const float* S2p = S2 + sx;
                const float* S3p = S3 + sx;

                __m512 _a0 = _mm512_set1_ps(alphap[0]);
                __m512 _a1 = _mm512_set1_ps(alphap[1]);
                __m512 _a2 = _mm512_set1_ps(alphap[2]);
                __m512 _a3 = _mm512_set1_ps(alphap[3]);

                __m512 _S20 = _mm512_load_ps(S2p - 16);
                __m512 _S21 = _mm512_load_ps(S2p + 0);
                __m512 _S22 = _mm512_load_ps(S2p + 16);
                __m512 _S23 = _mm512_load_ps(S2p + 32);
                __m512 _S30 = _mm512_load_ps(S3p - 16);
                __m512 _S31 = _mm512_load_ps(S3p + 0);
                __m512 _S32 = _mm512_load_ps(S3p + 16);
                __m512 _S33 = _mm512_load_ps(S3p + 32);
                __m512 _rows2 = _mm512_mul_ps(_S20, _a0);
                __m512 _rows3 = _mm512_mul_ps(_S30, _a0);
                _rows2 = _mm512_fmadd_ps(_S21, _a1, _rows2);
                _rows3 = _mm512_fmadd_ps(_S31, _a1, _rows3);
                _rows2 = _mm512_fmadd_ps(_S22, _a2, _rows2);
                _rows3 = _mm512_fmadd_ps(_S32, _a2, _rows3);
                _rows2 = _mm512_fmadd_ps(_S23, _a3, _rows2);
                _rows3 = _mm512_fmadd_ps(_S33, _a3, _rows3);
                _mm512_store_ps(rows2p + dx * 16, _rows2);
                _mm512_store_ps(rows3p + dx * 16, _rows3);

                alphap += 4;
            }
        }
        else if (sy == prev_sy1 + 3)
        {
            // hresize three rows
            float* rows0_old = rows0;
            float* rows1_old = rows1;
            float* rows2_old = rows2;
            rows0 = rows3;
            rows1 = rows0_old;
            rows2 = rows1_old;
            rows3 = rows2_old;
            const float* S1 = src.row(sy);
            const float* S2 = src.row(sy + 1);
            const float* S3 = src.row(sy + 2);

            const float* alphap = alpha;
            float* rows1p = rows1;
            float* rows2p = rows2;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx] * 16;
                const float* S1p = S1 + sx;
                const float* S2p = S2 + sx;
                const float* S3p = S3 + sx;

                __m512 _a0 = _mm512_set1_ps(alphap[0]);
                __m512 _a1 = _mm512_set1_ps(alphap[1]);
                __m512 _a2 = _mm512_set1_ps(alphap[2]);
                __m512 _a3 = _mm512_set1_ps(alphap[3]);

                __m512 _S10 = _mm512_load_ps(S1p - 16);
                __m512 _S11 = _mm512_load_ps(S1p + 0);
                __m512 _S12 = _mm512_load_ps(S1p + 16);
                __m512 _S13 = _mm512_load_ps(S1p + 32);
                __m512 _S20 = _mm512_load_ps(S2p - 16);
                __m512 _S21 = _mm512_load_ps(S2p + 0);
                __m512 _S22 = _mm512_load_ps(S2p + 16);
                __m512 _S23 = _mm512_load_ps(S2p + 32);
                __m512 _S30 = _mm512_load_ps(S3p - 16);
                __m512 _S31 = _mm512_load_ps(S3p + 0);
                __m512 _S32 = _mm512_load_ps(S3p + 16);
                __m512 _S33 = _mm512_load_ps(S3p + 32);
                __m512 _rows1 = _mm512_mul_ps(_S10, _a0);
                __m512 _rows2 = _mm512_mul_ps(_S20, _a0);
                __m512 _rows3 = _mm512_mul_ps(_S30, _a0);
                _rows1 = _mm512_fmadd_ps(_S11, _a1, _rows1);
                _rows2 = _mm512_fmadd_ps(_S21, _a1, _rows2);
                _rows3 = _mm512_fmadd_ps(_S31, _a1, _rows3);
                _rows1 = _mm512_fmadd_ps(_S12, _a2, _rows1);
                _rows2 = _mm512_fmadd_ps(_S22, _a2, _rows2);
                _rows3 = _mm512_fmadd_ps(_S32, _a2, _rows3);
                _rows1 = _mm512_fmadd_ps(_S13, _a3, _rows1);
                _rows2 = _mm512_fmadd_ps(_S23, _a3, _rows2);
                _rows3 = _mm512_fmadd_ps(_S33, _a3, _rows3);
                _mm512_store_ps(rows1p + dx * 16, _rows1);
                _mm512_store_ps(rows2p + dx * 16, _rows2);
                _mm512_store_ps(rows3p + dx * 16, _rows3);

                alphap += 4;
            }
        }
        else
        {
            // hresize four rows
            const float* S0 = src.row(sy - 1);
            const float* S1 = src.row(sy);
            const float* S2 = src.row(sy + 1);
            const float* S3 = src.row(sy + 2);

            const float* alphap = alpha;
            float* rows0p = rows0;
            float* rows1p = rows1;
            float* rows2p = rows2;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx] * 16;
                const float* S0p = S0 + sx;
                const float* S1p = S1 + sx;
                const float* S2p = S2 + sx;
                const float* S3p = S3 + sx;

                __m512 _a0 = _mm512_set1_ps(alphap[0]);
                __m512 _a1 = _mm512_set1_ps(alphap[1]);
                __m512 _a2 = _mm512_set1_ps(alphap[2]);
                __m512 _a3 = _mm512_set1_ps(alphap[3]);

                __m512 _S00 = _mm512_load_ps(S0p - 16);
                __m512 _S01 = _mm512_load_ps(S0p + 0);
                __m512 _S02 = _mm512_load_ps(S0p + 16);
                __m512 _S03 = _mm512_load_ps(S0p + 32);
                __m512 _S10 = _mm512_load_ps(S1p - 16);
                __m512 _S11 = _mm512_load_ps(S1p + 0);
                __m512 _S12 = _mm512_load_ps(S1p + 16);
                __m512 _S13 = _mm512_load_ps(S1p + 32);
                __m512 _S20 = _mm512_load_ps(S2p - 16);
                __m512 _S21 = _mm512_load_ps(S2p + 0);
                __m512 _S22 = _mm512_load_ps(S2p + 16);
                __m512 _S23 = _mm512_load_ps(S2p + 32);
                __m512 _S30 = _mm512_load_ps(S3p - 16);
                __m512 _S31 = _mm512_load_ps(S3p + 0);
                __m512 _S32 = _mm512_load_ps(S3p + 16);
                __m512 _S33 = _mm512_load_ps(S3p + 32);
                __m512 _rows0 = _mm512_mul_ps(_S00, _a0);
                __m512 _rows1 = _mm512_mul_ps(_S10, _a0);
                __m512 _rows2 = _mm512_mul_ps(_S20, _a0);
                __m512 _rows3 = _mm512_mul_ps(_S30, _a0);
                _rows0 = _mm512_fmadd_ps(_S01, _a1, _rows0);
                _rows1 = _mm512_fmadd_ps(_S11, _a1, _rows1);
                _rows2 = _mm512_fmadd_ps(_S21, _a1, _rows2);
                _rows3 = _mm512_fmadd_ps(_S31, _a1, _rows3);
                _rows0 = _mm512_fmadd_ps(_S02, _a2, _rows0);
                _rows1 = _mm512_fmadd_ps(_S12, _a2, _rows1);
                _rows2 = _mm512_fmadd_ps(_S22, _a2, _rows2);
                _rows3 = _mm512_fmadd_ps(_S32, _a2, _rows3);
                _rows0 = _mm512_fmadd_ps(_S03, _a3, _rows0);
                _rows1 = _mm512_fmadd_ps(_S13, _a3, _rows1);
                _rows2 = _mm512_fmadd_ps(_S23, _a3, _rows2);
                _rows3 = _mm512_fmadd_ps(_S33, _a3, _rows3);
                _mm512_store_ps(rows0p + dx * 16, _rows0);
                _mm512_store_ps(rows1p + dx * 16, _rows1);
                _mm512_store_ps(rows2p + dx * 16, _rows2);
                _mm512_store_ps(rows3p + dx * 16, _rows3);

                alphap += 4;
            }
        }

        prev_sy1 = sy;

        // vresize
        __m512 _b0 = _mm512_set1_ps(beta[0]);
        __m512 _b1 = _mm512_set1_ps(beta[1]);
        __m512 _b2 = _mm512_set1_ps(beta[2]);
        __m512 _b3 = _mm512_set1_ps(beta[3]);

        float* rows0p = rows0;
        float* rows1p = rows1;
        float* rows2p = rows2;
        float* rows3p = rows3;
        float* Dp = dst.row(dy);

        for (int dx = 0; dx < w; dx++)
        {
            __m512 _rows0 = _mm512_load_ps(rows0p);
            __m512 _rows1 = _mm512_load_ps(rows1p);
            __m512 _rows2 = _mm512_load_ps(rows2p);
            __m512 _rows3 = _mm512_load_ps(rows3p);
            __m512 _D = _mm512_mul_ps(_rows0, _b0);
            _D = _mm512_fmadd_ps(_rows1, _b1, _D);
            _D = _mm512_fmadd_ps(_rows2, _b2, _D);
            _D = _mm512_fmadd_ps(_rows3, _b3, _D);
            _mm512_store_ps(Dp, _D);

            Dp += 16;
            rows0p += 16;
            rows1p += 16;
            rows2p += 16;
            rows3p += 16;
        }

        beta += 4;
    }
}